

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

bool embree::avx2::CurveNvIntersectorK<8,8>::
     occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx2::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [32];
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Primitive PVar12;
  Geometry *pGVar13;
  code *pcVar14;
  RTCFilterFunctionN p_Var15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  long lVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  long lVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined8 uVar100;
  undefined1 auVar101 [32];
  undefined1 auVar102 [28];
  byte bVar103;
  int iVar104;
  ulong uVar105;
  ulong uVar106;
  bool bVar107;
  uint uVar108;
  ulong uVar109;
  ulong uVar110;
  long lVar111;
  undefined4 uVar112;
  undefined8 uVar113;
  float fVar127;
  undefined1 auVar114 [16];
  undefined1 auVar116 [16];
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float fVar126;
  float fVar128;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar115 [16];
  undefined1 auVar125 [32];
  float fVar132;
  undefined8 uVar133;
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  float fVar144;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [64];
  float fVar145;
  undefined1 auVar147 [16];
  float fVar146;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar148 [16];
  undefined1 auVar156 [32];
  undefined1 auVar149 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  float fVar162;
  float fVar165;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [64];
  undefined8 uVar186;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [64];
  undefined1 auVar200 [32];
  undefined1 in_ZMM10 [64];
  undefined4 uVar201;
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [64];
  float fVar206;
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar210 [64];
  undefined1 auVar211 [64];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [64];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  RTCFilterFunctionNArguments args;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  RTCFilterFunctionNArguments local_730;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_610 [8];
  float fStack_608;
  float fStack_604;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined4 local_5e0;
  undefined4 uStack_5dc;
  undefined4 uStack_5d8;
  undefined4 uStack_5d4;
  undefined4 uStack_5d0;
  undefined4 uStack_5cc;
  undefined4 uStack_5c8;
  undefined4 uStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined4 local_540;
  undefined4 uStack_53c;
  undefined4 uStack_538;
  undefined4 uStack_534;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined4 uStack_528;
  undefined4 uStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined4 local_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  int local_340;
  int local_33c;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  float local_2c0 [4];
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [32];
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar157 [32];
  
  PVar12 = prim[1];
  uVar105 = (ulong)(byte)PVar12;
  lVar88 = uVar105 * 0x19;
  fVar146 = *(float *)(prim + lVar88 + 0x12);
  auVar170 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar170 = vinsertps_avx(auVar170,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar170 = vsubps_avx(auVar170,*(undefined1 (*) [16])(prim + lVar88 + 6));
  auVar114._0_4_ = fVar146 * auVar170._0_4_;
  auVar114._4_4_ = fVar146 * auVar170._4_4_;
  auVar114._8_4_ = fVar146 * auVar170._8_4_;
  auVar114._12_4_ = fVar146 * auVar170._12_4_;
  auVar187._0_4_ = fVar146 * auVar16._0_4_;
  auVar187._4_4_ = fVar146 * auVar16._4_4_;
  auVar187._8_4_ = fVar146 * auVar16._8_4_;
  auVar187._12_4_ = fVar146 * auVar16._12_4_;
  auVar170._8_8_ = 0;
  auVar170._0_8_ = *(ulong *)(prim + uVar105 * 4 + 6);
  auVar117 = vpmovsxbd_avx2(auVar170);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar105 * 5 + 6);
  auVar141 = vpmovsxbd_avx2(auVar16);
  auVar141 = vcvtdq2ps_avx(auVar141);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar105 * 6 + 6);
  auVar123 = vpmovsxbd_avx2(auVar6);
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar105 * 0xb + 6);
  auVar179 = vpmovsxbd_avx2(auVar7);
  auVar179 = vcvtdq2ps_avx(auVar179);
  auVar167._8_8_ = 0;
  auVar167._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar12 * 0xc) + 6);
  auVar159 = vpmovsxbd_avx2(auVar167);
  auVar159 = vcvtdq2ps_avx(auVar159);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (uint)(byte)PVar12 * 0xc + uVar105 + 6);
  auVar18 = vpmovsxbd_avx2(auVar8);
  auVar18 = vcvtdq2ps_avx(auVar18);
  uVar109 = (ulong)(uint)((int)(uVar105 * 9) * 2);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar109 + 6);
  auVar19 = vpmovsxbd_avx2(auVar9);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar109 + uVar105 + 6);
  auVar193 = vpmovsxbd_avx2(auVar10);
  auVar193 = vcvtdq2ps_avx(auVar193);
  auVar205 = ZEXT3264(auVar193);
  uVar109 = (ulong)(uint)((int)(uVar105 * 5) << 2);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar109 + 6);
  auVar20 = vpmovsxbd_avx2(auVar11);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar214._4_4_ = auVar187._0_4_;
  auVar214._0_4_ = auVar187._0_4_;
  auVar214._8_4_ = auVar187._0_4_;
  auVar214._12_4_ = auVar187._0_4_;
  auVar214._16_4_ = auVar187._0_4_;
  auVar214._20_4_ = auVar187._0_4_;
  auVar214._24_4_ = auVar187._0_4_;
  auVar214._28_4_ = auVar187._0_4_;
  auVar170 = vmovshdup_avx(auVar187);
  uVar186 = auVar170._0_8_;
  auVar218._8_8_ = uVar186;
  auVar218._0_8_ = uVar186;
  auVar218._16_8_ = uVar186;
  auVar218._24_8_ = uVar186;
  auVar170 = vshufps_avx(auVar187,auVar187,0xaa);
  fVar146 = auVar170._0_4_;
  auVar185._0_4_ = fVar146 * auVar123._0_4_;
  fVar145 = auVar170._4_4_;
  auVar185._4_4_ = fVar145 * auVar123._4_4_;
  auVar185._8_4_ = fVar146 * auVar123._8_4_;
  auVar185._12_4_ = fVar145 * auVar123._12_4_;
  auVar185._16_4_ = fVar146 * auVar123._16_4_;
  auVar185._20_4_ = fVar145 * auVar123._20_4_;
  auVar185._28_36_ = in_ZMM12._28_36_;
  auVar185._24_4_ = fVar146 * auVar123._24_4_;
  auVar199._0_4_ = auVar18._0_4_ * fVar146;
  auVar199._4_4_ = auVar18._4_4_ * fVar145;
  auVar199._8_4_ = auVar18._8_4_ * fVar146;
  auVar199._12_4_ = auVar18._12_4_ * fVar145;
  auVar199._16_4_ = auVar18._16_4_ * fVar146;
  auVar199._20_4_ = auVar18._20_4_ * fVar145;
  auVar199._28_36_ = in_ZMM10._28_36_;
  auVar199._24_4_ = auVar18._24_4_ * fVar146;
  auVar196._0_4_ = auVar20._0_4_ * fVar146;
  auVar196._4_4_ = auVar20._4_4_ * fVar145;
  auVar196._8_4_ = auVar20._8_4_ * fVar146;
  auVar196._12_4_ = auVar20._12_4_ * fVar145;
  auVar196._16_4_ = auVar20._16_4_ * fVar146;
  auVar196._20_4_ = auVar20._20_4_ * fVar145;
  auVar196._24_4_ = auVar20._24_4_ * fVar146;
  auVar196._28_4_ = 0;
  auVar170 = vfmadd231ps_fma(auVar185._0_32_,auVar218,auVar141);
  auVar16 = vfmadd231ps_fma(auVar199._0_32_,auVar218,auVar159);
  auVar6 = vfmadd231ps_fma(auVar196,auVar193,auVar218);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar170),auVar214,auVar117);
  auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar214,auVar179);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar19,auVar214);
  auVar215._4_4_ = auVar114._0_4_;
  auVar215._0_4_ = auVar114._0_4_;
  auVar215._8_4_ = auVar114._0_4_;
  auVar215._12_4_ = auVar114._0_4_;
  auVar215._16_4_ = auVar114._0_4_;
  auVar215._20_4_ = auVar114._0_4_;
  auVar215._24_4_ = auVar114._0_4_;
  auVar215._28_4_ = auVar114._0_4_;
  auVar170 = vmovshdup_avx(auVar114);
  uVar186 = auVar170._0_8_;
  auVar219._8_8_ = uVar186;
  auVar219._0_8_ = uVar186;
  auVar219._16_8_ = uVar186;
  auVar219._24_8_ = uVar186;
  auVar170 = vshufps_avx(auVar114,auVar114,0xaa);
  fVar146 = auVar170._0_4_;
  auVar190._0_4_ = fVar146 * auVar123._0_4_;
  fVar145 = auVar170._4_4_;
  auVar190._4_4_ = fVar145 * auVar123._4_4_;
  auVar190._8_4_ = fVar146 * auVar123._8_4_;
  auVar190._12_4_ = fVar145 * auVar123._12_4_;
  auVar190._16_4_ = fVar146 * auVar123._16_4_;
  auVar190._20_4_ = fVar145 * auVar123._20_4_;
  auVar190._24_4_ = fVar146 * auVar123._24_4_;
  auVar190._28_4_ = 0;
  auVar125._4_4_ = auVar18._4_4_ * fVar145;
  auVar125._0_4_ = auVar18._0_4_ * fVar146;
  auVar125._8_4_ = auVar18._8_4_ * fVar146;
  auVar125._12_4_ = auVar18._12_4_ * fVar145;
  auVar125._16_4_ = auVar18._16_4_ * fVar146;
  auVar125._20_4_ = auVar18._20_4_ * fVar145;
  auVar125._24_4_ = auVar18._24_4_ * fVar146;
  auVar125._28_4_ = auVar123._28_4_;
  auVar123._4_4_ = auVar20._4_4_ * fVar145;
  auVar123._0_4_ = auVar20._0_4_ * fVar146;
  auVar123._8_4_ = auVar20._8_4_ * fVar146;
  auVar123._12_4_ = auVar20._12_4_ * fVar145;
  auVar123._16_4_ = auVar20._16_4_ * fVar146;
  auVar123._20_4_ = auVar20._20_4_ * fVar145;
  auVar123._24_4_ = auVar20._24_4_ * fVar146;
  auVar123._28_4_ = fVar145;
  auVar170 = vfmadd231ps_fma(auVar190,auVar219,auVar141);
  auVar167 = vfmadd231ps_fma(auVar125,auVar219,auVar159);
  auVar8 = vfmadd231ps_fma(auVar123,auVar219,auVar193);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar170),auVar215,auVar117);
  auVar167 = vfmadd231ps_fma(ZEXT1632(auVar167),auVar215,auVar179);
  local_3c0._8_4_ = 0x7fffffff;
  local_3c0._0_8_ = 0x7fffffff7fffffff;
  local_3c0._12_4_ = 0x7fffffff;
  local_3c0._16_4_ = 0x7fffffff;
  local_3c0._20_4_ = 0x7fffffff;
  local_3c0._24_4_ = 0x7fffffff;
  local_3c0._28_4_ = 0x7fffffff;
  auVar152._8_4_ = 0x219392ef;
  auVar152._0_8_ = 0x219392ef219392ef;
  auVar152._12_4_ = 0x219392ef;
  auVar152._16_4_ = 0x219392ef;
  auVar152._20_4_ = 0x219392ef;
  auVar152._24_4_ = 0x219392ef;
  auVar152._28_4_ = 0x219392ef;
  auVar117 = vandps_avx(ZEXT1632(auVar7),local_3c0);
  auVar117 = vcmpps_avx(auVar117,auVar152,1);
  auVar141 = vblendvps_avx(ZEXT1632(auVar7),auVar152,auVar117);
  auVar117 = vandps_avx(ZEXT1632(auVar16),local_3c0);
  auVar117 = vcmpps_avx(auVar117,auVar152,1);
  auVar123 = vblendvps_avx(ZEXT1632(auVar16),auVar152,auVar117);
  auVar117 = vandps_avx(ZEXT1632(auVar6),local_3c0);
  auVar117 = vcmpps_avx(auVar117,auVar152,1);
  auVar117 = vblendvps_avx(ZEXT1632(auVar6),auVar152,auVar117);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar215,auVar19);
  auVar179 = vrcpps_avx(auVar141);
  auVar175._8_4_ = 0x3f800000;
  auVar175._0_8_ = 0x3f8000003f800000;
  auVar175._12_4_ = 0x3f800000;
  auVar175._16_4_ = 0x3f800000;
  auVar175._20_4_ = 0x3f800000;
  auVar175._24_4_ = 0x3f800000;
  auVar175._28_4_ = 0x3f800000;
  auVar170 = vfnmadd213ps_fma(auVar141,auVar179,auVar175);
  auVar170 = vfmadd132ps_fma(ZEXT1632(auVar170),auVar179,auVar179);
  auVar141 = vrcpps_avx(auVar123);
  auVar16 = vfnmadd213ps_fma(auVar123,auVar141,auVar175);
  auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar141,auVar141);
  auVar141 = vrcpps_avx(auVar117);
  auVar6 = vfnmadd213ps_fma(auVar117,auVar141,auVar175);
  auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar141,auVar141);
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar105 * 7 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar9));
  auVar179._4_4_ = auVar170._4_4_ * auVar117._4_4_;
  auVar179._0_4_ = auVar170._0_4_ * auVar117._0_4_;
  auVar179._8_4_ = auVar170._8_4_ * auVar117._8_4_;
  auVar179._12_4_ = auVar170._12_4_ * auVar117._12_4_;
  auVar179._16_4_ = auVar117._16_4_ * 0.0;
  auVar179._20_4_ = auVar117._20_4_ * 0.0;
  auVar179._24_4_ = auVar117._24_4_ * 0.0;
  auVar179._28_4_ = auVar117._28_4_;
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar105 * 9 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar9));
  auVar159._4_4_ = auVar170._4_4_ * auVar117._4_4_;
  auVar159._0_4_ = auVar170._0_4_ * auVar117._0_4_;
  auVar159._8_4_ = auVar170._8_4_ * auVar117._8_4_;
  auVar159._12_4_ = auVar170._12_4_ * auVar117._12_4_;
  auVar159._16_4_ = auVar117._16_4_ * 0.0;
  auVar159._20_4_ = auVar117._20_4_ * 0.0;
  auVar159._24_4_ = auVar117._24_4_ * 0.0;
  auVar159._28_4_ = auVar117._28_4_;
  auVar134._1_3_ = 0;
  auVar134[0] = PVar12;
  auVar141 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar12 * 0x10 + 6));
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar12 * 0x10 + uVar105 * -2 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar167));
  auVar18._4_4_ = auVar117._4_4_ * auVar16._4_4_;
  auVar18._0_4_ = auVar117._0_4_ * auVar16._0_4_;
  auVar18._8_4_ = auVar117._8_4_ * auVar16._8_4_;
  auVar18._12_4_ = auVar117._12_4_ * auVar16._12_4_;
  auVar18._16_4_ = auVar117._16_4_ * 0.0;
  auVar18._20_4_ = auVar117._20_4_ * 0.0;
  auVar18._24_4_ = auVar117._24_4_ * 0.0;
  auVar18._28_4_ = auVar117._28_4_;
  auVar117 = vcvtdq2ps_avx(auVar141);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar167));
  auVar19._4_4_ = auVar16._4_4_ * auVar117._4_4_;
  auVar19._0_4_ = auVar16._0_4_ * auVar117._0_4_;
  auVar19._8_4_ = auVar16._8_4_ * auVar117._8_4_;
  auVar19._12_4_ = auVar16._12_4_ * auVar117._12_4_;
  auVar19._16_4_ = auVar117._16_4_ * 0.0;
  auVar19._20_4_ = auVar117._20_4_ * 0.0;
  auVar19._24_4_ = auVar117._24_4_ * 0.0;
  auVar19._28_4_ = auVar117._28_4_;
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar109 + uVar105 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar7));
  auVar193._4_4_ = auVar117._4_4_ * auVar6._4_4_;
  auVar193._0_4_ = auVar117._0_4_ * auVar6._0_4_;
  auVar193._8_4_ = auVar117._8_4_ * auVar6._8_4_;
  auVar193._12_4_ = auVar117._12_4_ * auVar6._12_4_;
  auVar193._16_4_ = auVar117._16_4_ * 0.0;
  auVar193._20_4_ = auVar117._20_4_ * 0.0;
  auVar193._24_4_ = auVar117._24_4_ * 0.0;
  auVar193._28_4_ = auVar117._28_4_;
  auVar117 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar105 * 0x17 + 6));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar7));
  auVar20._4_4_ = auVar6._4_4_ * auVar117._4_4_;
  auVar20._0_4_ = auVar6._0_4_ * auVar117._0_4_;
  auVar20._8_4_ = auVar6._8_4_ * auVar117._8_4_;
  auVar20._12_4_ = auVar6._12_4_ * auVar117._12_4_;
  auVar20._16_4_ = auVar117._16_4_ * 0.0;
  auVar20._20_4_ = auVar117._20_4_ * 0.0;
  auVar20._24_4_ = auVar117._24_4_ * 0.0;
  auVar20._28_4_ = auVar117._28_4_;
  auVar117 = vpminsd_avx2(auVar179,auVar159);
  auVar141 = vpminsd_avx2(auVar18,auVar19);
  auVar117 = vmaxps_avx(auVar117,auVar141);
  uVar112 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar182._4_4_ = uVar112;
  auVar182._0_4_ = uVar112;
  auVar182._8_4_ = uVar112;
  auVar182._12_4_ = uVar112;
  auVar182._16_4_ = uVar112;
  auVar182._20_4_ = uVar112;
  auVar182._24_4_ = uVar112;
  auVar182._28_4_ = uVar112;
  auVar141 = vpminsd_avx2(auVar193,auVar20);
  auVar141 = vmaxps_avx(auVar141,auVar182);
  auVar199 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                CONCAT424(0x3f7ffffa,
                                          CONCAT420(0x3f7ffffa,
                                                    CONCAT416(0x3f7ffffa,
                                                              CONCAT412(0x3f7ffffa,
                                                                        CONCAT48(0x3f7ffffa,
                                                                                 0x3f7ffffa3f7ffffa)
                                                                       ))))));
  auVar117 = vmaxps_avx(auVar117,auVar141);
  local_80._4_4_ = auVar117._4_4_ * 0.99999964;
  local_80._0_4_ = auVar117._0_4_ * 0.99999964;
  local_80._8_4_ = auVar117._8_4_ * 0.99999964;
  local_80._12_4_ = auVar117._12_4_ * 0.99999964;
  local_80._16_4_ = auVar117._16_4_ * 0.99999964;
  local_80._20_4_ = auVar117._20_4_ * 0.99999964;
  local_80._24_4_ = auVar117._24_4_ * 0.99999964;
  local_80._28_4_ = auVar141._28_4_;
  auVar117 = vpmaxsd_avx2(auVar179,auVar159);
  auVar141 = vpmaxsd_avx2(auVar18,auVar19);
  auVar117 = vminps_avx(auVar117,auVar141);
  auVar141 = vpmaxsd_avx2(auVar193,auVar20);
  uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar153._4_4_ = uVar112;
  auVar153._0_4_ = uVar112;
  auVar153._8_4_ = uVar112;
  auVar153._12_4_ = uVar112;
  auVar153._16_4_ = uVar112;
  auVar153._20_4_ = uVar112;
  auVar153._24_4_ = uVar112;
  auVar153._28_4_ = uVar112;
  auVar141 = vminps_avx(auVar141,auVar153);
  auVar117 = vminps_avx(auVar117,auVar141);
  auVar17._4_4_ = auVar117._4_4_ * 1.0000004;
  auVar17._0_4_ = auVar117._0_4_ * 1.0000004;
  auVar17._8_4_ = auVar117._8_4_ * 1.0000004;
  auVar17._12_4_ = auVar117._12_4_ * 1.0000004;
  auVar17._16_4_ = auVar117._16_4_ * 1.0000004;
  auVar17._20_4_ = auVar117._20_4_ * 1.0000004;
  auVar17._24_4_ = auVar117._24_4_ * 1.0000004;
  auVar17._28_4_ = auVar117._28_4_;
  auVar134[4] = PVar12;
  auVar134._5_3_ = 0;
  auVar134[8] = PVar12;
  auVar134._9_3_ = 0;
  auVar134[0xc] = PVar12;
  auVar134._13_3_ = 0;
  auVar134[0x10] = PVar12;
  auVar134._17_3_ = 0;
  auVar134[0x14] = PVar12;
  auVar134._21_3_ = 0;
  auVar134[0x18] = PVar12;
  auVar134._25_3_ = 0;
  auVar134[0x1c] = PVar12;
  auVar134._29_3_ = 0;
  auVar141 = vpcmpgtd_avx2(auVar134,_DAT_01fe9900);
  auVar117 = vcmpps_avx(local_80,auVar17,2);
  auVar117 = vandps_avx(auVar117,auVar141);
  uVar108 = vmovmskps_avx(auVar117);
  if (uVar108 == 0) {
    bVar107 = false;
  }
  else {
    uVar108 = uVar108 & 0xff;
    local_600 = mm_lookupmask_ps._16_8_;
    uStack_5f8 = mm_lookupmask_ps._24_8_;
    uStack_5f0 = mm_lookupmask_ps._16_8_;
    uStack_5e8 = mm_lookupmask_ps._24_8_;
    iVar104 = 1 << ((uint)k & 0x1f);
    auVar117._4_4_ = iVar104;
    auVar117._0_4_ = iVar104;
    auVar117._8_4_ = iVar104;
    auVar117._12_4_ = iVar104;
    auVar117._16_4_ = iVar104;
    auVar117._20_4_ = iVar104;
    auVar117._24_4_ = iVar104;
    auVar117._28_4_ = iVar104;
    auVar141 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar117 = vpand_avx2(auVar117,auVar141);
    local_3e0 = vpcmpeqd_avx2(auVar117,auVar141);
    local_3f0 = 0x7fffffff;
    uStack_3ec = 0x7fffffff;
    uStack_3e8 = 0x7fffffff;
    uStack_3e4 = 0x7fffffff;
    do {
      auVar117 = local_520;
      local_700 = auVar199._0_32_;
      auVar141 = auVar205._0_32_;
      lVar21 = 0;
      uVar109 = (ulong)uVar108;
      for (uVar105 = uVar109; (uVar105 & 1) == 0; uVar105 = uVar105 >> 1 | 0x8000000000000000) {
        lVar21 = lVar21 + 1;
      }
      uVar109 = uVar109 - 1 & uVar109;
      local_540 = *(undefined4 *)(prim + lVar21 * 4 + 6);
      uVar105 = (ulong)(uint)((int)lVar21 << 6);
      local_920._4_4_ = *(undefined4 *)(prim + 2);
      pGVar13 = (context->scene->geometries).items[(uint)local_920._4_4_].ptr;
      pPVar1 = prim + uVar105 + lVar88 + 0x16;
      uVar186 = *(undefined8 *)pPVar1;
      uVar100 = *(undefined8 *)(pPVar1 + 8);
      auVar16 = *(undefined1 (*) [16])pPVar1;
      auVar170 = *(undefined1 (*) [16])pPVar1;
      if (uVar109 != 0) {
        uVar110 = uVar109 - 1 & uVar109;
        for (uVar106 = uVar109; (uVar106 & 1) == 0; uVar106 = uVar106 >> 1 | 0x8000000000000000) {
        }
        if (uVar110 != 0) {
          for (; (uVar110 & 1) == 0; uVar110 = uVar110 >> 1 | 0x8000000000000000) {
          }
        }
      }
      auVar6 = *(undefined1 (*) [16])(prim + uVar105 + lVar88 + 0x26);
      auVar7 = *(undefined1 (*) [16])(prim + uVar105 + lVar88 + 0x36);
      _local_610 = *(undefined1 (*) [16])(prim + uVar105 + lVar88 + 0x46);
      iVar104 = (int)pGVar13[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar167 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar10 = vinsertps_avx(auVar167,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar8 = vsubps_avx(*(undefined1 (*) [16])pPVar1,auVar10);
      uVar112 = auVar8._0_4_;
      auVar166._4_4_ = uVar112;
      auVar166._0_4_ = uVar112;
      auVar166._8_4_ = uVar112;
      auVar166._12_4_ = uVar112;
      auVar167 = vshufps_avx(auVar8,auVar8,0x55);
      auVar8 = vshufps_avx(auVar8,auVar8,0xaa);
      aVar4 = pre->ray_space[k].vx.field_0;
      aVar5 = pre->ray_space[k].vy.field_0;
      fVar146 = pre->ray_space[k].vz.field_0.m128[0];
      fVar145 = pre->ray_space[k].vz.field_0.m128[1];
      fVar126 = pre->ray_space[k].vz.field_0.m128[2];
      fVar127 = pre->ray_space[k].vz.field_0.m128[3];
      auVar180._0_4_ = fVar146 * auVar8._0_4_;
      auVar180._4_4_ = fVar145 * auVar8._4_4_;
      auVar180._8_4_ = fVar126 * auVar8._8_4_;
      auVar180._12_4_ = fVar127 * auVar8._12_4_;
      auVar167 = vfmadd231ps_fma(auVar180,(undefined1  [16])aVar5,auVar167);
      auVar114 = vfmadd231ps_fma(auVar167,(undefined1  [16])aVar4,auVar166);
      auVar167 = vblendps_avx(auVar114,*(undefined1 (*) [16])pPVar1,8);
      auVar9 = vsubps_avx(auVar6,auVar10);
      uVar112 = auVar9._0_4_;
      auVar181._4_4_ = uVar112;
      auVar181._0_4_ = uVar112;
      auVar181._8_4_ = uVar112;
      auVar181._12_4_ = uVar112;
      auVar8 = vshufps_avx(auVar9,auVar9,0x55);
      auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
      auVar195._0_4_ = fVar146 * auVar9._0_4_;
      auVar195._4_4_ = fVar145 * auVar9._4_4_;
      auVar195._8_4_ = fVar126 * auVar9._8_4_;
      auVar195._12_4_ = fVar127 * auVar9._12_4_;
      auVar8 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar5,auVar8);
      auVar187 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar4,auVar181);
      auVar8 = vblendps_avx(auVar187,auVar6,8);
      auVar11 = vsubps_avx(auVar7,auVar10);
      uVar112 = auVar11._0_4_;
      auVar188._4_4_ = uVar112;
      auVar188._0_4_ = uVar112;
      auVar188._8_4_ = uVar112;
      auVar188._12_4_ = uVar112;
      auVar9 = vshufps_avx(auVar11,auVar11,0x55);
      auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
      auVar202._0_4_ = fVar146 * auVar11._0_4_;
      auVar202._4_4_ = fVar145 * auVar11._4_4_;
      auVar202._8_4_ = fVar126 * auVar11._8_4_;
      auVar202._12_4_ = fVar127 * auVar11._12_4_;
      auVar9 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar5,auVar9);
      auVar166 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar4,auVar188);
      auVar9 = vblendps_avx(auVar166,auVar7,8);
      auVar11 = vsubps_avx(_local_610,auVar10);
      uVar112 = auVar11._0_4_;
      auVar189._4_4_ = uVar112;
      auVar189._0_4_ = uVar112;
      auVar189._8_4_ = uVar112;
      auVar189._12_4_ = uVar112;
      auVar10 = vshufps_avx(auVar11,auVar11,0x55);
      auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
      auVar207._0_4_ = fVar146 * auVar11._0_4_;
      auVar207._4_4_ = fVar145 * auVar11._4_4_;
      auVar207._8_4_ = fVar126 * auVar11._8_4_;
      auVar207._12_4_ = fVar127 * auVar11._12_4_;
      auVar10 = vfmadd231ps_fma(auVar207,(undefined1  [16])aVar5,auVar10);
      auVar180 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar4,auVar189);
      auVar10 = vblendps_avx(auVar180,_local_610,8);
      auVar23._4_4_ = uStack_3ec;
      auVar23._0_4_ = local_3f0;
      auVar23._8_4_ = uStack_3e8;
      auVar23._12_4_ = uStack_3e4;
      auVar167 = vandps_avx(auVar167,auVar23);
      auVar8 = vandps_avx(auVar8,auVar23);
      auVar11 = vmaxps_avx(auVar167,auVar8);
      auVar167 = vandps_avx(auVar9,auVar23);
      auVar8 = vandps_avx(auVar10,auVar23);
      auVar167 = vmaxps_avx(auVar167,auVar8);
      auVar167 = vmaxps_avx(auVar11,auVar167);
      auVar8 = vmovshdup_avx(auVar167);
      auVar8 = vmaxss_avx(auVar8,auVar167);
      auVar167 = vshufpd_avx(auVar167,auVar167,1);
      auVar167 = vmaxss_avx(auVar167,auVar8);
      lVar21 = (long)iVar104 * 0x44;
      auVar8 = vmovshdup_avx(auVar114);
      uVar113 = auVar8._0_8_;
      local_580._8_8_ = uVar113;
      local_580._0_8_ = uVar113;
      local_580._16_8_ = uVar113;
      local_580._24_8_ = uVar113;
      auVar8 = vmovshdup_avx(auVar187);
      uVar113 = auVar8._0_8_;
      auVar220._8_8_ = uVar113;
      auVar220._0_8_ = uVar113;
      auVar220._16_8_ = uVar113;
      auVar220._24_8_ = uVar113;
      auVar123 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x908);
      uVar201 = auVar166._0_4_;
      auVar154._4_4_ = uVar201;
      auVar154._0_4_ = uVar201;
      auVar154._8_4_ = uVar201;
      auVar154._12_4_ = uVar201;
      auVar154._16_4_ = uVar201;
      auVar154._20_4_ = uVar201;
      auVar154._24_4_ = uVar201;
      auVar154._28_4_ = uVar201;
      auVar8 = vmovshdup_avx(auVar166);
      uVar113 = auVar8._0_8_;
      auVar203._8_8_ = uVar113;
      auVar203._0_8_ = uVar113;
      auVar203._16_8_ = uVar113;
      auVar203._24_8_ = uVar113;
      fVar146 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar21 + 0xd8c);
      auVar102 = *(undefined1 (*) [28])(bspline_basis0 + lVar21 + 0xd8c);
      fVar206 = auVar180._0_4_;
      auVar8 = vmovshdup_avx(auVar180);
      uVar113 = auVar8._0_8_;
      auVar24._4_4_ = fVar206 * *(float *)(bspline_basis0 + lVar21 + 0xd90);
      auVar24._0_4_ = fVar206 * fVar146;
      auVar24._8_4_ = fVar206 * *(float *)(bspline_basis0 + lVar21 + 0xd94);
      auVar24._12_4_ = fVar206 * *(float *)(bspline_basis0 + lVar21 + 0xd98);
      auVar24._16_4_ = fVar206 * *(float *)(bspline_basis0 + lVar21 + 0xd9c);
      auVar24._20_4_ = fVar206 * *(float *)(bspline_basis0 + lVar21 + 0xda0);
      auVar24._24_4_ = fVar206 * *(float *)(bspline_basis0 + lVar21 + 0xda4);
      auVar24._28_4_ = *(undefined4 *)(bspline_basis0 + lVar21 + 0xda8);
      auVar9 = vfmadd231ps_fma(auVar24,auVar123,auVar154);
      fVar162 = auVar8._0_4_;
      auVar212._0_4_ = fVar162 * fVar146;
      fVar165 = auVar8._4_4_;
      auVar212._4_4_ = fVar165 * *(float *)(bspline_basis0 + lVar21 + 0xd90);
      auVar212._8_4_ = fVar162 * *(float *)(bspline_basis0 + lVar21 + 0xd94);
      auVar212._12_4_ = fVar165 * *(float *)(bspline_basis0 + lVar21 + 0xd98);
      auVar212._16_4_ = fVar162 * *(float *)(bspline_basis0 + lVar21 + 0xd9c);
      auVar212._20_4_ = fVar165 * *(float *)(bspline_basis0 + lVar21 + 0xda0);
      auVar212._24_4_ = fVar162 * *(float *)(bspline_basis0 + lVar21 + 0xda4);
      auVar212._28_4_ = 0;
      auVar8 = vfmadd231ps_fma(auVar212,auVar123,auVar203);
      auVar179 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x484);
      uVar112 = auVar187._0_4_;
      auVar200._4_4_ = uVar112;
      auVar200._0_4_ = uVar112;
      auVar200._8_4_ = uVar112;
      auVar200._12_4_ = uVar112;
      auVar200._16_4_ = uVar112;
      auVar200._20_4_ = uVar112;
      auVar200._24_4_ = uVar112;
      auVar200._28_4_ = uVar112;
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar179,auVar200);
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar179,auVar220);
      auVar159 = *(undefined1 (*) [32])(bspline_basis0 + lVar21);
      local_660._0_4_ = auVar114._0_4_;
      auVar216._4_4_ = local_660._0_4_;
      auVar216._0_4_ = local_660._0_4_;
      auVar216._8_4_ = local_660._0_4_;
      auVar216._12_4_ = local_660._0_4_;
      auVar216._16_4_ = local_660._0_4_;
      auVar216._20_4_ = local_660._0_4_;
      auVar216._24_4_ = local_660._0_4_;
      auVar216._28_4_ = local_660._0_4_;
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar159,auVar216);
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar159,local_580);
      auVar18 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x908);
      fVar131 = *(float *)(bspline_basis1 + lVar21 + 0xd8c);
      fVar89 = *(float *)(bspline_basis1 + lVar21 + 0xd90);
      fVar90 = *(float *)(bspline_basis1 + lVar21 + 0xd94);
      fVar91 = *(float *)(bspline_basis1 + lVar21 + 0xd98);
      fVar92 = *(float *)(bspline_basis1 + lVar21 + 0xd9c);
      fVar93 = *(float *)(bspline_basis1 + lVar21 + 0xda0);
      fVar94 = *(float *)(bspline_basis1 + lVar21 + 0xda4);
      auVar25._4_4_ = fVar89 * fVar206;
      auVar25._0_4_ = fVar131 * fVar206;
      auVar25._8_4_ = fVar90 * fVar206;
      auVar25._12_4_ = fVar91 * fVar206;
      auVar25._16_4_ = fVar92 * fVar206;
      auVar25._20_4_ = fVar93 * fVar206;
      auVar25._24_4_ = fVar94 * fVar206;
      auVar25._28_4_ = *(undefined4 *)(bspline_basis0 + lVar21 + 0xda8);
      auVar9 = vfmadd231ps_fma(auVar25,auVar18,auVar154);
      auVar26._4_4_ = fVar89 * fVar165;
      auVar26._0_4_ = fVar131 * fVar162;
      auVar26._8_4_ = fVar90 * fVar162;
      auVar26._12_4_ = fVar91 * fVar165;
      auVar26._16_4_ = fVar92 * fVar162;
      auVar26._20_4_ = fVar93 * fVar165;
      auVar26._24_4_ = fVar94 * fVar162;
      auVar26._28_4_ = uVar201;
      auVar11 = vfmadd231ps_fma(auVar26,auVar18,auVar203);
      auVar19 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x484);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar19,auVar200);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar19,auVar220);
      auVar193 = *(undefined1 (*) [32])(bspline_basis1 + lVar21);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar193,auVar216);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar193,local_580);
      local_420 = ZEXT1632(auVar9);
      auVar134 = ZEXT1632(auVar10);
      auVar125 = vsubps_avx(local_420,auVar134);
      local_440 = ZEXT1632(auVar11);
      local_460 = ZEXT1632(auVar8);
      _local_480 = vsubps_avx(local_440,local_460);
      auVar118._0_4_ = auVar8._0_4_ * auVar125._0_4_;
      auVar118._4_4_ = auVar8._4_4_ * auVar125._4_4_;
      auVar118._8_4_ = auVar8._8_4_ * auVar125._8_4_;
      auVar118._12_4_ = auVar8._12_4_ * auVar125._12_4_;
      auVar118._16_4_ = auVar125._16_4_ * 0.0;
      auVar118._20_4_ = auVar125._20_4_ * 0.0;
      auVar118._24_4_ = auVar125._24_4_ * 0.0;
      auVar118._28_4_ = 0;
      fVar146 = local_480._0_4_;
      auVar135._0_4_ = auVar10._0_4_ * fVar146;
      fVar145 = local_480._4_4_;
      auVar135._4_4_ = auVar10._4_4_ * fVar145;
      fVar126 = local_480._8_4_;
      auVar135._8_4_ = auVar10._8_4_ * fVar126;
      fVar127 = local_480._12_4_;
      auVar135._12_4_ = auVar10._12_4_ * fVar127;
      fVar128 = local_480._16_4_;
      auVar135._16_4_ = fVar128 * 0.0;
      fVar129 = local_480._20_4_;
      auVar135._20_4_ = fVar129 * 0.0;
      fVar130 = local_480._24_4_;
      auVar135._24_4_ = fVar130 * 0.0;
      auVar135._28_4_ = 0;
      auVar17 = vsubps_avx(auVar118,auVar135);
      auVar8 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
      uVar133 = auVar8._0_8_;
      local_a0._8_8_ = uVar133;
      local_a0._0_8_ = uVar133;
      local_a0._16_8_ = uVar133;
      local_a0._24_8_ = uVar133;
      auVar9 = vpermilps_avx(auVar6,0xff);
      uVar133 = auVar9._0_8_;
      local_c0._8_8_ = uVar133;
      local_c0._0_8_ = uVar133;
      local_c0._16_8_ = uVar133;
      local_c0._24_8_ = uVar133;
      auVar9 = vpermilps_avx(auVar7,0xff);
      uVar133 = auVar9._0_8_;
      local_e0._8_8_ = uVar133;
      local_e0._0_8_ = uVar133;
      local_e0._16_8_ = uVar133;
      local_e0._24_8_ = uVar133;
      auVar9 = vpermilps_avx(_local_610,0xff);
      local_100 = auVar9._0_8_;
      local_8e0._0_4_ = auVar102._0_4_;
      local_8e0._4_4_ = auVar102._4_4_;
      fStack_8d8 = auVar102._8_4_;
      fStack_8d4 = auVar102._12_4_;
      fStack_8d0 = auVar102._16_4_;
      fStack_8cc = auVar102._20_4_;
      fStack_8c8 = auVar102._24_4_;
      fVar132 = auVar9._0_4_;
      fVar144 = auVar9._4_4_;
      auVar27._4_4_ = fVar144 * (float)local_8e0._4_4_;
      auVar27._0_4_ = fVar132 * (float)local_8e0._0_4_;
      auVar27._8_4_ = fVar132 * fStack_8d8;
      auVar27._12_4_ = fVar144 * fStack_8d4;
      auVar27._16_4_ = fVar132 * fStack_8d0;
      auVar27._20_4_ = fVar144 * fStack_8cc;
      auVar27._24_4_ = fVar132 * fStack_8c8;
      auVar27._28_4_ = local_660._0_4_;
      auVar9 = vfmadd231ps_fma(auVar27,local_e0,auVar123);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar179,local_c0);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar159,local_a0);
      uStack_f8 = local_100;
      uStack_f0 = local_100;
      uStack_e8 = local_100;
      auVar28._4_4_ = fVar89 * fVar144;
      auVar28._0_4_ = fVar131 * fVar132;
      auVar28._8_4_ = fVar90 * fVar132;
      auVar28._12_4_ = fVar91 * fVar144;
      auVar28._16_4_ = fVar92 * fVar132;
      auVar28._20_4_ = fVar93 * fVar144;
      auVar28._24_4_ = fVar94 * fVar132;
      auVar28._28_4_ = auVar159._28_4_;
      auVar11 = vfmadd231ps_fma(auVar28,auVar18,local_e0);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar19,local_c0);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar193,local_a0);
      auVar29._4_4_ = fVar145 * fVar145;
      auVar29._0_4_ = fVar146 * fVar146;
      auVar29._8_4_ = fVar126 * fVar126;
      auVar29._12_4_ = fVar127 * fVar127;
      auVar29._16_4_ = fVar128 * fVar128;
      auVar29._20_4_ = fVar129 * fVar129;
      auVar29._24_4_ = fVar130 * fVar130;
      auVar29._28_4_ = auVar8._4_4_;
      auVar8 = vfmadd231ps_fma(auVar29,auVar125,auVar125);
      auVar20 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar11));
      auVar30._4_4_ = auVar20._4_4_ * auVar20._4_4_ * auVar8._4_4_;
      auVar30._0_4_ = auVar20._0_4_ * auVar20._0_4_ * auVar8._0_4_;
      auVar30._8_4_ = auVar20._8_4_ * auVar20._8_4_ * auVar8._8_4_;
      auVar30._12_4_ = auVar20._12_4_ * auVar20._12_4_ * auVar8._12_4_;
      auVar30._16_4_ = auVar20._16_4_ * auVar20._16_4_ * 0.0;
      auVar30._20_4_ = auVar20._20_4_ * auVar20._20_4_ * 0.0;
      auVar30._24_4_ = auVar20._24_4_ * auVar20._24_4_ * 0.0;
      auVar30._28_4_ = auVar20._28_4_;
      auVar31._4_4_ = auVar17._4_4_ * auVar17._4_4_;
      auVar31._0_4_ = auVar17._0_4_ * auVar17._0_4_;
      auVar31._8_4_ = auVar17._8_4_ * auVar17._8_4_;
      auVar31._12_4_ = auVar17._12_4_ * auVar17._12_4_;
      auVar31._16_4_ = auVar17._16_4_ * auVar17._16_4_;
      auVar31._20_4_ = auVar17._20_4_ * auVar17._20_4_;
      auVar31._24_4_ = auVar17._24_4_ * auVar17._24_4_;
      auVar31._28_4_ = auVar17._28_4_;
      auVar20 = vcmpps_avx(auVar31,auVar30,2);
      fVar146 = auVar167._0_4_ * 4.7683716e-07;
      auVar119._0_4_ = (float)iVar104;
      local_520._4_12_ = auVar180._4_12_;
      local_520._0_4_ = auVar119._0_4_;
      local_520._16_16_ = auVar117._16_16_;
      auVar119._4_4_ = auVar119._0_4_;
      auVar119._8_4_ = auVar119._0_4_;
      auVar119._12_4_ = auVar119._0_4_;
      auVar119._16_4_ = auVar119._0_4_;
      auVar119._20_4_ = auVar119._0_4_;
      auVar119._24_4_ = auVar119._0_4_;
      auVar119._28_4_ = auVar119._0_4_;
      auVar117 = vcmpps_avx(_DAT_01faff40,auVar119,1);
      auVar8 = vpermilps_avx(auVar114,0xaa);
      uVar133 = auVar8._0_8_;
      local_660._8_8_ = uVar133;
      local_660._0_8_ = uVar133;
      local_660._16_8_ = uVar133;
      local_660._24_8_ = uVar133;
      auVar167 = vpermilps_avx(auVar187,0xaa);
      uVar133 = auVar167._0_8_;
      auVar163._8_8_ = uVar133;
      auVar163._0_8_ = uVar133;
      auVar163._16_8_ = uVar133;
      auVar163._24_8_ = uVar133;
      auVar167 = vpermilps_avx(auVar166,0xaa);
      uVar133 = auVar167._0_8_;
      local_500._8_8_ = uVar133;
      local_500._0_8_ = uVar133;
      local_500._16_8_ = uVar133;
      local_500._24_8_ = uVar133;
      auVar167 = vshufps_avx(auVar180,auVar180,0xaa);
      uVar133 = auVar167._0_8_;
      register0x00001508 = uVar133;
      local_680 = uVar133;
      register0x00001510 = uVar133;
      register0x00001518 = uVar133;
      auVar17 = auVar117 & auVar20;
      uVar112 = *(undefined4 *)(ray + k * 4 + 0x60);
      local_740 = auVar6._0_8_;
      uStack_738 = auVar6._8_8_;
      local_750 = auVar7._0_8_;
      uStack_748 = auVar7._8_8_;
      if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar17 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar17 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar17 >> 0x7f,0) == '\0') &&
            (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar17 >> 0xbf,0) == '\0') &&
          (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar17[0x1f])
      {
        auVar205 = ZEXT3264(auVar141);
        auVar191 = ZEXT3264(CONCAT428(fVar206,CONCAT424(fVar206,CONCAT420(fVar206,CONCAT416(fVar206,
                                                  CONCAT412(fVar206,CONCAT48(fVar206,CONCAT44(
                                                  fVar206,fVar206))))))));
        auVar185 = ZEXT3264(CONCAT428(fVar165,CONCAT424(fVar162,CONCAT420(fVar165,CONCAT416(fVar162,
                                                  CONCAT412(fVar165,CONCAT48(fVar162,uVar113)))))));
LAB_017a2464:
        auVar211 = ZEXT3264(_local_680);
        bVar107 = false;
      }
      else {
        local_5e0 = SUB84(pGVar13,0);
        uStack_5dc = (undefined4)((ulong)pGVar13 >> 0x20);
        _local_4a0 = vandps_avx(auVar20,auVar117);
        fVar132 = auVar167._0_4_;
        fVar144 = auVar167._4_4_;
        auVar32._4_4_ = fVar144 * fVar89;
        auVar32._0_4_ = fVar132 * fVar131;
        auVar32._8_4_ = fVar132 * fVar90;
        auVar32._12_4_ = fVar144 * fVar91;
        auVar32._16_4_ = fVar132 * fVar92;
        auVar32._20_4_ = fVar144 * fVar93;
        auVar32._24_4_ = fVar132 * fVar94;
        auVar32._28_4_ = local_4a0._28_4_;
        auVar167 = vfmadd213ps_fma(auVar18,local_500,auVar32);
        auVar167 = vfmadd213ps_fma(auVar19,auVar163,ZEXT1632(auVar167));
        auVar167 = vfmadd213ps_fma(auVar193,local_660,ZEXT1632(auVar167));
        local_5c0 = ZEXT1632(auVar167);
        auVar33._4_4_ = fVar144 * (float)local_8e0._4_4_;
        auVar33._0_4_ = fVar132 * (float)local_8e0._0_4_;
        auVar33._8_4_ = fVar132 * fStack_8d8;
        auVar33._12_4_ = fVar144 * fStack_8d4;
        auVar33._16_4_ = fVar132 * fStack_8d0;
        auVar33._20_4_ = fVar144 * fStack_8cc;
        auVar33._24_4_ = fVar132 * fStack_8c8;
        auVar33._28_4_ = local_4a0._28_4_;
        auVar167 = vfmadd213ps_fma(auVar123,local_500,auVar33);
        auVar167 = vfmadd213ps_fma(auVar179,auVar163,ZEXT1632(auVar167));
        auVar117 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x1210);
        auVar123 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x1694);
        auVar179 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x1b18);
        fVar145 = *(float *)(bspline_basis0 + lVar21 + 0x1f9c);
        fVar126 = *(float *)(bspline_basis0 + lVar21 + 0x1fa0);
        fVar127 = *(float *)(bspline_basis0 + lVar21 + 0x1fa4);
        fVar128 = *(float *)(bspline_basis0 + lVar21 + 0x1fa8);
        fVar129 = *(float *)(bspline_basis0 + lVar21 + 0x1fac);
        fVar130 = *(float *)(bspline_basis0 + lVar21 + 0x1fb0);
        fVar131 = *(float *)(bspline_basis0 + lVar21 + 0x1fb4);
        auVar34._4_4_ = fVar206 * fVar126;
        auVar34._0_4_ = fVar206 * fVar145;
        auVar34._8_4_ = fVar206 * fVar127;
        auVar34._12_4_ = fVar206 * fVar128;
        auVar34._16_4_ = fVar206 * fVar129;
        auVar34._20_4_ = fVar206 * fVar130;
        auVar34._24_4_ = fVar206 * fVar131;
        auVar34._28_4_ = local_480._28_4_;
        auVar35._4_4_ = fVar165 * fVar126;
        auVar35._0_4_ = fVar162 * fVar145;
        auVar35._8_4_ = fVar162 * fVar127;
        auVar35._12_4_ = fVar165 * fVar128;
        auVar35._16_4_ = fVar162 * fVar129;
        auVar35._20_4_ = fVar165 * fVar130;
        auVar35._24_4_ = fVar162 * fVar131;
        auVar35._28_4_ = *(undefined4 *)(bspline_basis1 + lVar21 + 0xda8);
        auVar36._4_4_ = fVar144 * fVar126;
        auVar36._0_4_ = fVar132 * fVar145;
        auVar36._8_4_ = fVar132 * fVar127;
        auVar36._12_4_ = fVar144 * fVar128;
        auVar36._16_4_ = fVar132 * fVar129;
        auVar36._20_4_ = fVar144 * fVar130;
        auVar36._24_4_ = fVar132 * fVar131;
        auVar36._28_4_ = auVar125._28_4_;
        auVar114 = vfmadd231ps_fma(auVar34,auVar179,auVar154);
        auVar187 = vfmadd231ps_fma(auVar35,auVar179,auVar203);
        auVar166 = vfmadd231ps_fma(auVar36,local_500,auVar179);
        auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar123,auVar200);
        auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar123,auVar220);
        auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar163,auVar123);
        auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar117,auVar216);
        auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar117,local_580);
        auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),local_660,auVar117);
        fVar145 = *(float *)(bspline_basis1 + lVar21 + 0x1f9c);
        fVar126 = *(float *)(bspline_basis1 + lVar21 + 0x1fa0);
        fVar127 = *(float *)(bspline_basis1 + lVar21 + 0x1fa4);
        fVar128 = *(float *)(bspline_basis1 + lVar21 + 0x1fa8);
        fVar129 = *(float *)(bspline_basis1 + lVar21 + 0x1fac);
        fVar130 = *(float *)(bspline_basis1 + lVar21 + 0x1fb0);
        fVar131 = *(float *)(bspline_basis1 + lVar21 + 0x1fb4);
        auVar37._4_4_ = fVar206 * fVar126;
        auVar37._0_4_ = fVar206 * fVar145;
        auVar37._8_4_ = fVar206 * fVar127;
        auVar37._12_4_ = fVar206 * fVar128;
        auVar37._16_4_ = fVar206 * fVar129;
        auVar37._20_4_ = fVar206 * fVar130;
        auVar37._24_4_ = fVar206 * fVar131;
        auVar37._28_4_ = fVar206;
        auVar38._4_4_ = fVar165 * fVar126;
        auVar38._0_4_ = fVar162 * fVar145;
        auVar38._8_4_ = fVar162 * fVar127;
        auVar38._12_4_ = fVar165 * fVar128;
        auVar38._16_4_ = fVar162 * fVar129;
        auVar38._20_4_ = fVar165 * fVar130;
        auVar38._24_4_ = fVar162 * fVar131;
        auVar38._28_4_ = fVar165;
        auVar39._4_4_ = fVar126 * fVar144;
        auVar39._0_4_ = fVar145 * fVar132;
        auVar39._8_4_ = fVar127 * fVar132;
        auVar39._12_4_ = fVar128 * fVar144;
        auVar39._16_4_ = fVar129 * fVar132;
        auVar39._20_4_ = fVar130 * fVar144;
        auVar39._24_4_ = fVar131 * fVar132;
        auVar39._28_4_ = auVar8._4_4_;
        auVar117 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x1b18);
        auVar8 = vfmadd231ps_fma(auVar37,auVar117,auVar154);
        auVar180 = vfmadd231ps_fma(auVar38,auVar117,auVar203);
        auVar23 = vfmadd231ps_fma(auVar39,auVar117,local_500);
        auVar117 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x1694);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar117,auVar200);
        auVar180 = vfmadd231ps_fma(ZEXT1632(auVar180),auVar117,auVar220);
        auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar163,auVar117);
        auVar117 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x1210);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar117,auVar216);
        auVar180 = vfmadd231ps_fma(ZEXT1632(auVar180),auVar117,local_580);
        auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),local_660,auVar117);
        auVar117 = vandps_avx(local_3c0,ZEXT1632(auVar114));
        auVar123 = vandps_avx(ZEXT1632(auVar187),local_3c0);
        auVar123 = vmaxps_avx(auVar117,auVar123);
        auVar117 = vandps_avx(ZEXT1632(auVar166),local_3c0);
        auVar117 = vmaxps_avx(auVar123,auVar117);
        auVar136._4_4_ = fVar146;
        auVar136._0_4_ = fVar146;
        auVar136._8_4_ = fVar146;
        auVar136._12_4_ = fVar146;
        auVar136._16_4_ = fVar146;
        auVar136._20_4_ = fVar146;
        auVar136._24_4_ = fVar146;
        auVar136._28_4_ = fVar146;
        auVar117 = vcmpps_avx(auVar117,auVar136,1);
        auVar179 = vblendvps_avx(ZEXT1632(auVar114),auVar125,auVar117);
        auVar18 = vblendvps_avx(ZEXT1632(auVar187),_local_480,auVar117);
        auVar117 = vandps_avx(ZEXT1632(auVar8),local_3c0);
        auVar123 = vandps_avx(ZEXT1632(auVar180),local_3c0);
        auVar123 = vmaxps_avx(auVar117,auVar123);
        auVar117 = vandps_avx(ZEXT1632(auVar23),local_3c0);
        auVar117 = vmaxps_avx(auVar123,auVar117);
        auVar123 = vcmpps_avx(auVar117,auVar136,1);
        auVar117 = vblendvps_avx(ZEXT1632(auVar8),auVar125,auVar123);
        auVar123 = vblendvps_avx(ZEXT1632(auVar180),_local_480,auVar123);
        auVar167 = vfmadd213ps_fma(auVar159,local_660,ZEXT1632(auVar167));
        auVar8 = vfmadd213ps_fma(auVar179,auVar179,ZEXT832(0) << 0x20);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar18,auVar18);
        auVar159 = vrsqrtps_avx(ZEXT1632(auVar8));
        fVar145 = auVar159._0_4_;
        fVar126 = auVar159._4_4_;
        fVar127 = auVar159._8_4_;
        fVar128 = auVar159._12_4_;
        fVar129 = auVar159._16_4_;
        fVar130 = auVar159._20_4_;
        fVar131 = auVar159._24_4_;
        auVar40._4_4_ = fVar126 * fVar126 * fVar126 * auVar8._4_4_ * -0.5;
        auVar40._0_4_ = fVar145 * fVar145 * fVar145 * auVar8._0_4_ * -0.5;
        auVar40._8_4_ = fVar127 * fVar127 * fVar127 * auVar8._8_4_ * -0.5;
        auVar40._12_4_ = fVar128 * fVar128 * fVar128 * auVar8._12_4_ * -0.5;
        auVar40._16_4_ = fVar129 * fVar129 * fVar129 * -0.0;
        auVar40._20_4_ = fVar130 * fVar130 * fVar130 * -0.0;
        auVar40._24_4_ = fVar131 * fVar131 * fVar131 * -0.0;
        auVar40._28_4_ = 0;
        auVar213._8_4_ = 0x3fc00000;
        auVar213._0_8_ = 0x3fc000003fc00000;
        auVar213._12_4_ = 0x3fc00000;
        auVar213._16_4_ = 0x3fc00000;
        auVar213._20_4_ = 0x3fc00000;
        auVar213._24_4_ = 0x3fc00000;
        auVar213._28_4_ = 0x3fc00000;
        auVar8 = vfmadd231ps_fma(auVar40,auVar213,auVar159);
        fVar145 = auVar8._0_4_;
        fVar126 = auVar8._4_4_;
        auVar41._4_4_ = auVar18._4_4_ * fVar126;
        auVar41._0_4_ = auVar18._0_4_ * fVar145;
        fVar127 = auVar8._8_4_;
        auVar41._8_4_ = auVar18._8_4_ * fVar127;
        fVar128 = auVar8._12_4_;
        auVar41._12_4_ = auVar18._12_4_ * fVar128;
        auVar41._16_4_ = auVar18._16_4_ * 0.0;
        auVar41._20_4_ = auVar18._20_4_ * 0.0;
        auVar41._24_4_ = auVar18._24_4_ * 0.0;
        auVar41._28_4_ = auVar159._28_4_;
        auVar42._4_4_ = -auVar179._4_4_ * fVar126;
        auVar42._0_4_ = -auVar179._0_4_ * fVar145;
        auVar42._8_4_ = -auVar179._8_4_ * fVar127;
        auVar42._12_4_ = -auVar179._12_4_ * fVar128;
        auVar42._16_4_ = -auVar179._16_4_ * 0.0;
        auVar42._20_4_ = -auVar179._20_4_ * 0.0;
        auVar42._24_4_ = -auVar179._24_4_ * 0.0;
        auVar42._28_4_ = 0;
        auVar8 = vfmadd213ps_fma(auVar117,auVar117,ZEXT832(0) << 0x20);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar123,auVar123);
        auVar179 = vrsqrtps_avx(ZEXT1632(auVar8));
        auVar159 = ZEXT1632(CONCAT412(fVar128 * 0.0,
                                      CONCAT48(fVar127 * 0.0,CONCAT44(fVar126 * 0.0,fVar145 * 0.0)))
                           );
        fVar145 = auVar179._0_4_;
        fVar126 = auVar179._4_4_;
        fVar127 = auVar179._8_4_;
        fVar128 = auVar179._12_4_;
        fVar129 = auVar179._16_4_;
        fVar130 = auVar179._20_4_;
        fVar131 = auVar179._24_4_;
        auVar43._4_4_ = fVar126 * fVar126 * fVar126 * auVar8._4_4_ * -0.5;
        auVar43._0_4_ = fVar145 * fVar145 * fVar145 * auVar8._0_4_ * -0.5;
        auVar43._8_4_ = fVar127 * fVar127 * fVar127 * auVar8._8_4_ * -0.5;
        auVar43._12_4_ = fVar128 * fVar128 * fVar128 * auVar8._12_4_ * -0.5;
        auVar43._16_4_ = fVar129 * fVar129 * fVar129 * -0.0;
        auVar43._20_4_ = fVar130 * fVar130 * fVar130 * -0.0;
        auVar43._24_4_ = fVar131 * fVar131 * fVar131 * -0.0;
        auVar43._28_4_ = 0xbf000000;
        auVar8 = vfmadd231ps_fma(auVar43,auVar213,auVar179);
        fVar145 = auVar8._0_4_;
        fVar126 = auVar8._4_4_;
        auVar44._4_4_ = fVar126 * auVar123._4_4_;
        auVar44._0_4_ = fVar145 * auVar123._0_4_;
        fVar127 = auVar8._8_4_;
        auVar44._8_4_ = fVar127 * auVar123._8_4_;
        fVar128 = auVar8._12_4_;
        auVar44._12_4_ = fVar128 * auVar123._12_4_;
        auVar44._16_4_ = auVar123._16_4_ * 0.0;
        auVar44._20_4_ = auVar123._20_4_ * 0.0;
        auVar44._24_4_ = auVar123._24_4_ * 0.0;
        auVar44._28_4_ = 0;
        auVar45._4_4_ = fVar126 * -auVar117._4_4_;
        auVar45._0_4_ = fVar145 * -auVar117._0_4_;
        auVar45._8_4_ = fVar127 * -auVar117._8_4_;
        auVar45._12_4_ = fVar128 * -auVar117._12_4_;
        auVar45._16_4_ = -auVar117._16_4_ * 0.0;
        auVar45._20_4_ = -auVar117._20_4_ * 0.0;
        auVar45._24_4_ = -auVar117._24_4_ * 0.0;
        auVar45._28_4_ = 0x3fc00000;
        auVar46._28_4_ = auVar179._28_4_;
        auVar46._0_28_ =
             ZEXT1628(CONCAT412(fVar128 * 0.0,
                                CONCAT48(fVar127 * 0.0,CONCAT44(fVar126 * 0.0,fVar145 * 0.0))));
        auVar8 = vfmadd213ps_fma(auVar41,ZEXT1632(auVar9),auVar134);
        auVar117 = ZEXT1632(auVar9);
        auVar114 = vfmadd213ps_fma(auVar42,auVar117,local_460);
        auVar187 = vfmadd213ps_fma(auVar159,auVar117,ZEXT1632(auVar167));
        auVar181 = vfnmadd213ps_fma(auVar41,auVar117,auVar134);
        auVar166 = vfmadd213ps_fma(auVar44,ZEXT1632(auVar11),local_420);
        auVar188 = vfnmadd213ps_fma(auVar42,auVar117,local_460);
        auVar117 = ZEXT1632(auVar11);
        auVar180 = vfmadd213ps_fma(auVar45,auVar117,local_440);
        auVar182 = ZEXT1632(auVar9);
        auVar202 = vfnmadd231ps_fma(ZEXT1632(auVar167),auVar182,auVar159);
        auVar9 = vfmadd213ps_fma(auVar46,auVar117,local_5c0);
        auVar189 = vfnmadd213ps_fma(auVar44,auVar117,local_420);
        auVar195 = vfnmadd213ps_fma(auVar45,auVar117,local_440);
        auVar207 = vfnmadd231ps_fma(local_5c0,ZEXT1632(auVar11),auVar46);
        auVar117 = vsubps_avx(ZEXT1632(auVar180),ZEXT1632(auVar188));
        auVar123 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar202));
        auVar155._0_4_ = auVar202._0_4_ * auVar117._0_4_;
        auVar155._4_4_ = auVar202._4_4_ * auVar117._4_4_;
        auVar155._8_4_ = auVar202._8_4_ * auVar117._8_4_;
        auVar155._12_4_ = auVar202._12_4_ * auVar117._12_4_;
        auVar155._16_4_ = auVar117._16_4_ * 0.0;
        auVar155._20_4_ = auVar117._20_4_ * 0.0;
        auVar155._24_4_ = auVar117._24_4_ * 0.0;
        auVar155._28_4_ = 0;
        auVar23 = vfmsub231ps_fma(auVar155,ZEXT1632(auVar188),auVar123);
        auVar47._4_4_ = auVar181._4_4_ * auVar123._4_4_;
        auVar47._0_4_ = auVar181._0_4_ * auVar123._0_4_;
        auVar47._8_4_ = auVar181._8_4_ * auVar123._8_4_;
        auVar47._12_4_ = auVar181._12_4_ * auVar123._12_4_;
        auVar47._16_4_ = auVar123._16_4_ * 0.0;
        auVar47._20_4_ = auVar123._20_4_ * 0.0;
        auVar47._24_4_ = auVar123._24_4_ * 0.0;
        auVar47._28_4_ = auVar123._28_4_;
        auVar193 = ZEXT1632(auVar181);
        auVar123 = vsubps_avx(ZEXT1632(auVar166),auVar193);
        auVar167 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar202),auVar123);
        auVar48._4_4_ = auVar188._4_4_ * auVar123._4_4_;
        auVar48._0_4_ = auVar188._0_4_ * auVar123._0_4_;
        auVar48._8_4_ = auVar188._8_4_ * auVar123._8_4_;
        auVar48._12_4_ = auVar188._12_4_ * auVar123._12_4_;
        auVar48._16_4_ = auVar123._16_4_ * 0.0;
        auVar48._20_4_ = auVar123._20_4_ * 0.0;
        auVar48._24_4_ = auVar123._24_4_ * 0.0;
        auVar48._28_4_ = auVar123._28_4_;
        auVar181 = vfmsub231ps_fma(auVar48,auVar193,auVar117);
        auVar167 = vfmadd231ps_fma(ZEXT1632(auVar181),ZEXT832(0) << 0x20,ZEXT1632(auVar167));
        auVar167 = vfmadd231ps_fma(ZEXT1632(auVar167),ZEXT832(0) << 0x20,ZEXT1632(auVar23));
        auVar17 = vcmpps_avx(ZEXT1632(auVar167),ZEXT832(0) << 0x20,2);
        auVar117 = vblendvps_avx(ZEXT1632(auVar189),ZEXT1632(auVar8),auVar17);
        auVar123 = vblendvps_avx(ZEXT1632(auVar195),ZEXT1632(auVar114),auVar17);
        auVar179 = vblendvps_avx(ZEXT1632(auVar207),ZEXT1632(auVar187),auVar17);
        auVar159 = vblendvps_avx(auVar193,ZEXT1632(auVar166),auVar17);
        auVar18 = vblendvps_avx(ZEXT1632(auVar188),ZEXT1632(auVar180),auVar17);
        auVar19 = vblendvps_avx(ZEXT1632(auVar202),ZEXT1632(auVar9),auVar17);
        auVar193 = vblendvps_avx(ZEXT1632(auVar166),auVar193,auVar17);
        auVar20 = vblendvps_avx(ZEXT1632(auVar180),ZEXT1632(auVar188),auVar17);
        auVar167 = vpackssdw_avx(local_4a0._0_16_,local_4a0._16_16_);
        auVar125 = vblendvps_avx(ZEXT1632(auVar9),ZEXT1632(auVar202),auVar17);
        auVar134 = vsubps_avx(auVar193,auVar117);
        auVar20 = vsubps_avx(auVar20,auVar123);
        auVar152 = vsubps_avx(auVar125,auVar179);
        auVar153 = vsubps_avx(auVar117,auVar159);
        auVar175 = vsubps_avx(auVar123,auVar18);
        auVar190 = vsubps_avx(auVar179,auVar19);
        auVar49._4_4_ = auVar152._4_4_ * auVar117._4_4_;
        auVar49._0_4_ = auVar152._0_4_ * auVar117._0_4_;
        auVar49._8_4_ = auVar152._8_4_ * auVar117._8_4_;
        auVar49._12_4_ = auVar152._12_4_ * auVar117._12_4_;
        auVar49._16_4_ = auVar152._16_4_ * auVar117._16_4_;
        auVar49._20_4_ = auVar152._20_4_ * auVar117._20_4_;
        auVar49._24_4_ = auVar152._24_4_ * auVar117._24_4_;
        auVar49._28_4_ = auVar125._28_4_;
        auVar8 = vfmsub231ps_fma(auVar49,auVar179,auVar134);
        auVar50._4_4_ = auVar134._4_4_ * auVar123._4_4_;
        auVar50._0_4_ = auVar134._0_4_ * auVar123._0_4_;
        auVar50._8_4_ = auVar134._8_4_ * auVar123._8_4_;
        auVar50._12_4_ = auVar134._12_4_ * auVar123._12_4_;
        auVar50._16_4_ = auVar134._16_4_ * auVar123._16_4_;
        auVar50._20_4_ = auVar134._20_4_ * auVar123._20_4_;
        auVar50._24_4_ = auVar134._24_4_ * auVar123._24_4_;
        auVar50._28_4_ = auVar193._28_4_;
        auVar9 = vfmsub231ps_fma(auVar50,auVar117,auVar20);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar9),ZEXT832(0) << 0x20,ZEXT1632(auVar8));
        auVar120._0_4_ = auVar20._0_4_ * auVar179._0_4_;
        auVar120._4_4_ = auVar20._4_4_ * auVar179._4_4_;
        auVar120._8_4_ = auVar20._8_4_ * auVar179._8_4_;
        auVar120._12_4_ = auVar20._12_4_ * auVar179._12_4_;
        auVar120._16_4_ = auVar20._16_4_ * auVar179._16_4_;
        auVar120._20_4_ = auVar20._20_4_ * auVar179._20_4_;
        auVar120._24_4_ = auVar20._24_4_ * auVar179._24_4_;
        auVar120._28_4_ = 0;
        auVar9 = vfmsub231ps_fma(auVar120,auVar123,auVar152);
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT832(0) << 0x20,ZEXT1632(auVar9));
        auVar121._0_4_ = auVar190._0_4_ * auVar159._0_4_;
        auVar121._4_4_ = auVar190._4_4_ * auVar159._4_4_;
        auVar121._8_4_ = auVar190._8_4_ * auVar159._8_4_;
        auVar121._12_4_ = auVar190._12_4_ * auVar159._12_4_;
        auVar121._16_4_ = auVar190._16_4_ * auVar159._16_4_;
        auVar121._20_4_ = auVar190._20_4_ * auVar159._20_4_;
        auVar121._24_4_ = auVar190._24_4_ * auVar159._24_4_;
        auVar121._28_4_ = 0;
        auVar8 = vfmsub231ps_fma(auVar121,auVar153,auVar19);
        auVar51._4_4_ = auVar175._4_4_ * auVar19._4_4_;
        auVar51._0_4_ = auVar175._0_4_ * auVar19._0_4_;
        auVar51._8_4_ = auVar175._8_4_ * auVar19._8_4_;
        auVar51._12_4_ = auVar175._12_4_ * auVar19._12_4_;
        auVar51._16_4_ = auVar175._16_4_ * auVar19._16_4_;
        auVar51._20_4_ = auVar175._20_4_ * auVar19._20_4_;
        auVar51._24_4_ = auVar175._24_4_ * auVar19._24_4_;
        auVar51._28_4_ = auVar19._28_4_;
        auVar114 = vfmsub231ps_fma(auVar51,auVar18,auVar190);
        auVar52._4_4_ = auVar153._4_4_ * auVar18._4_4_;
        auVar52._0_4_ = auVar153._0_4_ * auVar18._0_4_;
        auVar52._8_4_ = auVar153._8_4_ * auVar18._8_4_;
        auVar52._12_4_ = auVar153._12_4_ * auVar18._12_4_;
        auVar52._16_4_ = auVar153._16_4_ * auVar18._16_4_;
        auVar52._20_4_ = auVar153._20_4_ * auVar18._20_4_;
        auVar52._24_4_ = auVar153._24_4_ * auVar18._24_4_;
        auVar52._28_4_ = auVar18._28_4_;
        auVar187 = vfmsub231ps_fma(auVar52,auVar175,auVar159);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar187),ZEXT832(0) << 0x20,ZEXT1632(auVar8));
        auVar114 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT832(0) << 0x20,ZEXT1632(auVar114));
        auVar159 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar114));
        auVar159 = vcmpps_avx(auVar159,ZEXT832(0) << 0x20,2);
        auVar8 = vpackssdw_avx(auVar159._0_16_,auVar159._16_16_);
        auVar167 = vpand_avx(auVar167,auVar8);
        auVar159 = vpmovsxwd_avx2(auVar167);
        if ((((((((auVar159 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar159 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar159 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar159 >> 0x7f,0) == '\0') &&
              (auVar159 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar159 >> 0xbf,0) == '\0') &&
            (auVar159 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar159[0x1f]) {
          auVar199 = ZEXT864(0) << 0x20;
LAB_017a3fa4:
          auVar185 = ZEXT3264(CONCAT824(uStack_5e8,
                                        CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
          auVar205 = ZEXT3264(auVar141);
        }
        else {
          auVar53._4_4_ = auVar20._4_4_ * auVar190._4_4_;
          auVar53._0_4_ = auVar20._0_4_ * auVar190._0_4_;
          auVar53._8_4_ = auVar20._8_4_ * auVar190._8_4_;
          auVar53._12_4_ = auVar20._12_4_ * auVar190._12_4_;
          auVar53._16_4_ = auVar20._16_4_ * auVar190._16_4_;
          auVar53._20_4_ = auVar20._20_4_ * auVar190._20_4_;
          auVar53._24_4_ = auVar20._24_4_ * auVar190._24_4_;
          auVar53._28_4_ = auVar159._28_4_;
          auVar180 = vfmsub231ps_fma(auVar53,auVar175,auVar152);
          auVar137._0_4_ = auVar153._0_4_ * auVar152._0_4_;
          auVar137._4_4_ = auVar153._4_4_ * auVar152._4_4_;
          auVar137._8_4_ = auVar153._8_4_ * auVar152._8_4_;
          auVar137._12_4_ = auVar153._12_4_ * auVar152._12_4_;
          auVar137._16_4_ = auVar153._16_4_ * auVar152._16_4_;
          auVar137._20_4_ = auVar153._20_4_ * auVar152._20_4_;
          auVar137._24_4_ = auVar153._24_4_ * auVar152._24_4_;
          auVar137._28_4_ = 0;
          auVar166 = vfmsub231ps_fma(auVar137,auVar134,auVar190);
          auVar54._4_4_ = auVar134._4_4_ * auVar175._4_4_;
          auVar54._0_4_ = auVar134._0_4_ * auVar175._0_4_;
          auVar54._8_4_ = auVar134._8_4_ * auVar175._8_4_;
          auVar54._12_4_ = auVar134._12_4_ * auVar175._12_4_;
          auVar54._16_4_ = auVar134._16_4_ * auVar175._16_4_;
          auVar54._20_4_ = auVar134._20_4_ * auVar175._20_4_;
          auVar54._24_4_ = auVar134._24_4_ * auVar175._24_4_;
          auVar54._28_4_ = auVar134._28_4_;
          auVar23 = vfmsub231ps_fma(auVar54,auVar153,auVar20);
          auVar8 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar166),ZEXT1632(auVar23));
          auVar187 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT1632(auVar180),_DAT_01faff00);
          auVar159 = vrcpps_avx(ZEXT1632(auVar187));
          auVar204._8_4_ = 0x3f800000;
          auVar204._0_8_ = 0x3f8000003f800000;
          auVar204._12_4_ = 0x3f800000;
          auVar204._16_4_ = 0x3f800000;
          auVar204._20_4_ = 0x3f800000;
          auVar204._24_4_ = 0x3f800000;
          auVar204._28_4_ = 0x3f800000;
          auVar8 = vfnmadd213ps_fma(auVar159,ZEXT1632(auVar187),auVar204);
          auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar159,auVar159);
          auVar55._4_4_ = auVar23._4_4_ * auVar179._4_4_;
          auVar55._0_4_ = auVar23._0_4_ * auVar179._0_4_;
          auVar55._8_4_ = auVar23._8_4_ * auVar179._8_4_;
          auVar55._12_4_ = auVar23._12_4_ * auVar179._12_4_;
          auVar55._16_4_ = auVar179._16_4_ * 0.0;
          auVar55._20_4_ = auVar179._20_4_ * 0.0;
          auVar55._24_4_ = auVar179._24_4_ * 0.0;
          auVar55._28_4_ = auVar179._28_4_;
          auVar166 = vfmadd231ps_fma(auVar55,auVar123,ZEXT1632(auVar166));
          auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),ZEXT1632(auVar180),auVar117);
          fVar145 = auVar8._0_4_;
          fVar126 = auVar8._4_4_;
          fVar127 = auVar8._8_4_;
          fVar128 = auVar8._12_4_;
          auVar56._28_4_ = auVar123._28_4_;
          auVar56._0_28_ =
               ZEXT1628(CONCAT412(fVar128 * auVar166._12_4_,
                                  CONCAT48(fVar127 * auVar166._8_4_,
                                           CONCAT44(fVar126 * auVar166._4_4_,
                                                    fVar145 * auVar166._0_4_))));
          auVar122._4_4_ = uVar112;
          auVar122._0_4_ = uVar112;
          auVar122._8_4_ = uVar112;
          auVar122._12_4_ = uVar112;
          auVar122._16_4_ = uVar112;
          auVar122._20_4_ = uVar112;
          auVar122._24_4_ = uVar112;
          auVar122._28_4_ = uVar112;
          uVar201 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar138._4_4_ = uVar201;
          auVar138._0_4_ = uVar201;
          auVar138._8_4_ = uVar201;
          auVar138._12_4_ = uVar201;
          auVar138._16_4_ = uVar201;
          auVar138._20_4_ = uVar201;
          auVar138._24_4_ = uVar201;
          auVar138._28_4_ = uVar201;
          auVar117 = vcmpps_avx(auVar122,auVar56,2);
          auVar123 = vcmpps_avx(auVar56,auVar138,2);
          auVar117 = vandps_avx(auVar123,auVar117);
          auVar8 = vpackssdw_avx(auVar117._0_16_,auVar117._16_16_);
          auVar167 = vpand_avx(auVar167,auVar8);
          auVar117 = vpmovsxwd_avx2(auVar167);
          auVar199 = ZEXT864(0) << 0x20;
          if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar117 >> 0x7f,0) == '\0') &&
                (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar117 >> 0xbf,0) == '\0') &&
              (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar117[0x1f]) goto LAB_017a3fa4;
          auVar117 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar187),4);
          auVar8 = vpackssdw_avx(auVar117._0_16_,auVar117._16_16_);
          auVar167 = vpand_avx(auVar167,auVar8);
          auVar117 = vpmovsxwd_avx2(auVar167);
          auVar185 = ZEXT3264(CONCAT824(uStack_5e8,
                                        CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
          auVar205 = ZEXT3264(auVar141);
          if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar117 >> 0x7f,0) != '\0') ||
                (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar117 >> 0xbf,0) != '\0') ||
              (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar117[0x1f] < '\0') {
            auVar123 = ZEXT1632(CONCAT412(fVar128 * auVar9._12_4_,
                                          CONCAT48(fVar127 * auVar9._8_4_,
                                                   CONCAT44(fVar126 * auVar9._4_4_,
                                                            fVar145 * auVar9._0_4_))));
            auVar57._28_4_ = local_560._28_4_;
            auVar57._0_28_ =
                 ZEXT1628(CONCAT412(fVar128 * auVar114._12_4_,
                                    CONCAT48(fVar127 * auVar114._8_4_,
                                             CONCAT44(fVar126 * auVar114._4_4_,
                                                      fVar145 * auVar114._0_4_))));
            auVar173._8_4_ = 0x3f800000;
            auVar173._0_8_ = 0x3f8000003f800000;
            auVar173._12_4_ = 0x3f800000;
            auVar173._16_4_ = 0x3f800000;
            auVar173._20_4_ = 0x3f800000;
            auVar173._24_4_ = 0x3f800000;
            auVar173._28_4_ = 0x3f800000;
            auVar141 = vsubps_avx(auVar173,auVar123);
            auVar141 = vblendvps_avx(auVar141,auVar123,auVar17);
            auVar205 = ZEXT3264(auVar141);
            auVar141 = vsubps_avx(auVar173,auVar57);
            local_4c0 = vblendvps_avx(auVar141,auVar57,auVar17);
            auVar185 = ZEXT3264(auVar117);
            local_560 = auVar56;
          }
        }
        auVar143 = ZEXT3264(auVar163);
        auVar211 = ZEXT3264(_local_680);
        auVar117 = auVar185._0_32_;
        if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar117 >> 0x7f,0) == '\0') &&
              (auVar185 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar117 >> 0xbf,0) == '\0') &&
            (auVar185 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar185[0x1f]) {
          bVar107 = false;
          auVar191 = ZEXT3264(CONCAT428(fVar206,CONCAT424(fVar206,CONCAT420(fVar206,CONCAT416(
                                                  fVar206,CONCAT412(fVar206,CONCAT48(fVar206,
                                                  CONCAT44(fVar206,fVar206))))))));
          auVar185 = ZEXT3264(CONCAT428(fVar165,CONCAT424(fVar162,CONCAT420(fVar165,CONCAT416(
                                                  fVar162,CONCAT412(fVar165,CONCAT48(fVar162,uVar113
                                                                                    )))))));
        }
        else {
          auVar141 = vsubps_avx(ZEXT1632(auVar11),auVar182);
          auVar179 = auVar205._0_32_;
          auVar167 = vfmadd213ps_fma(auVar141,auVar179,auVar182);
          fVar145 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar141._4_4_ = (auVar167._4_4_ + auVar167._4_4_) * fVar145;
          auVar141._0_4_ = (auVar167._0_4_ + auVar167._0_4_) * fVar145;
          auVar141._8_4_ = (auVar167._8_4_ + auVar167._8_4_) * fVar145;
          auVar141._12_4_ = (auVar167._12_4_ + auVar167._12_4_) * fVar145;
          auVar141._16_4_ = fVar145 * 0.0;
          auVar141._20_4_ = fVar145 * 0.0;
          auVar141._24_4_ = fVar145 * 0.0;
          auVar141._28_4_ = 0;
          auVar141 = vcmpps_avx(local_560,auVar141,6);
          auVar123 = auVar117 & auVar141;
          auVar191 = ZEXT3264(CONCAT428(fVar206,CONCAT424(fVar206,CONCAT420(fVar206,CONCAT416(
                                                  fVar206,CONCAT412(fVar206,CONCAT48(fVar206,
                                                  CONCAT44(fVar206,fVar206))))))));
          auVar185 = ZEXT3264(CONCAT428(fVar165,CONCAT424(fVar162,CONCAT420(fVar165,CONCAT416(
                                                  fVar162,CONCAT412(fVar165,CONCAT48(fVar162,uVar113
                                                                                    )))))));
          if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar123 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar123 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar123 >> 0x7f,0) == '\0') &&
                (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar123 >> 0xbf,0) == '\0') &&
              (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar123[0x1f]) {
            bVar107 = false;
          }
          else {
            auVar139._8_4_ = 0xbf800000;
            auVar139._0_8_ = 0xbf800000bf800000;
            auVar139._12_4_ = 0xbf800000;
            auVar139._16_4_ = 0xbf800000;
            auVar139._20_4_ = 0xbf800000;
            auVar139._24_4_ = 0xbf800000;
            auVar139._28_4_ = 0xbf800000;
            auVar156._8_4_ = 0x40000000;
            auVar156._0_8_ = 0x4000000040000000;
            auVar156._12_4_ = 0x40000000;
            auVar156._16_4_ = 0x40000000;
            auVar156._20_4_ = 0x40000000;
            auVar156._24_4_ = 0x40000000;
            auVar156._28_4_ = 0x40000000;
            auVar167 = vfmadd213ps_fma(local_4c0,auVar156,auVar139);
            local_380 = ZEXT1632(auVar167);
            local_340 = 0;
            local_320 = local_740;
            uStack_318 = uStack_738;
            local_310 = local_750;
            uStack_308 = uStack_748;
            local_4c0 = local_380;
            if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_017a2464;
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (bVar107 = true, pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar117 = vandps_avx(auVar141,auVar117);
              fVar145 = 1.0 / auVar119._0_4_;
              local_2c0[0] = fVar145 * (auVar205._0_4_ + 0.0);
              local_2c0[1] = fVar145 * (auVar205._4_4_ + 1.0);
              local_2c0[2] = fVar145 * (auVar205._8_4_ + 2.0);
              local_2c0[3] = fVar145 * (auVar205._12_4_ + 3.0);
              fStack_2b0 = fVar145 * (auVar205._16_4_ + 4.0);
              fStack_2ac = fVar145 * (auVar205._20_4_ + 5.0);
              fStack_2a8 = fVar145 * (auVar205._24_4_ + 6.0);
              fStack_2a4 = auVar205._28_4_ + 7.0;
              local_4c0._0_8_ = auVar167._0_8_;
              local_4c0._8_8_ = auVar167._8_8_;
              local_2a0 = local_4c0._0_8_;
              uStack_298 = local_4c0._8_8_;
              uStack_290 = 0;
              uStack_288 = 0;
              local_280 = local_560;
              uVar108 = vmovmskps_avx(auVar117);
              if (uVar108 == 0) {
                bVar107 = false;
              }
              else {
                uVar105 = 0;
                local_940._0_8_ = ZEXT48(uVar108 & 0xff);
                for (uVar106 = local_940._0_8_; (uVar106 & 1) == 0;
                    uVar106 = uVar106 >> 1 | 0x8000000000000000) {
                  uVar105 = uVar105 + 1;
                }
                local_920._0_4_ = local_920._4_4_;
                local_920._8_4_ = local_920._4_4_;
                local_920._12_4_ = local_920._4_4_;
                local_920._16_4_ = local_920._4_4_;
                local_920._20_4_ = local_920._4_4_;
                local_920._24_4_ = local_920._4_4_;
                local_920._28_4_ = local_920._4_4_;
                local_6c0._4_4_ = local_540;
                local_6c0._0_4_ = local_540;
                local_6c0._8_4_ = local_540;
                local_6c0._12_4_ = local_540;
                local_6c0._16_4_ = local_540;
                local_6c0._20_4_ = local_540;
                local_6c0._24_4_ = local_540;
                local_6c0._28_4_ = local_540;
                local_5a0 = ZEXT1632(CONCAT124(auVar10._4_12_,*(undefined4 *)(ray + k * 4 + 0x100)))
                ;
                local_6e0 = auVar163;
                local_3a0 = auVar179;
                local_360 = local_560;
                local_33c = iVar104;
                local_330 = uVar186;
                uStack_328 = uVar100;
                do {
                  fVar145 = local_2c0[uVar105];
                  auVar115._4_4_ = fVar145;
                  auVar115._0_4_ = fVar145;
                  auVar115._8_4_ = fVar145;
                  auVar115._12_4_ = fVar145;
                  local_200._16_4_ = fVar145;
                  local_200._0_16_ = auVar115;
                  local_200._20_4_ = fVar145;
                  local_200._24_4_ = fVar145;
                  local_200._28_4_ = fVar145;
                  local_1e0 = *(undefined4 *)((long)&local_2a0 + uVar105 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_280 + uVar105 * 4);
                  fVar127 = 1.0 - fVar145;
                  auVar167 = ZEXT416((uint)(fVar145 * fVar127 * 4.0));
                  auVar8 = vfnmsub213ss_fma(auVar115,auVar115,auVar167);
                  auVar167 = vfmadd213ss_fma(ZEXT416((uint)fVar127),ZEXT416((uint)fVar127),auVar167)
                  ;
                  fVar126 = auVar167._0_4_ * 0.5;
                  fVar145 = fVar145 * fVar145 * 0.5;
                  auVar168._0_4_ = fVar145 * (float)local_610._0_4_;
                  auVar168._4_4_ = fVar145 * (float)local_610._4_4_;
                  auVar168._8_4_ = fVar145 * fStack_608;
                  auVar168._12_4_ = fVar145 * fStack_604;
                  auVar147._4_4_ = fVar126;
                  auVar147._0_4_ = fVar126;
                  auVar147._8_4_ = fVar126;
                  auVar147._12_4_ = fVar126;
                  auVar167 = vfmadd132ps_fma(auVar147,auVar168,auVar7);
                  fVar145 = auVar8._0_4_ * 0.5;
                  auVar169._4_4_ = fVar145;
                  auVar169._0_4_ = fVar145;
                  auVar169._8_4_ = fVar145;
                  auVar169._12_4_ = fVar145;
                  auVar167 = vfmadd132ps_fma(auVar169,auVar167,auVar6);
                  local_730.context = context->user;
                  fVar145 = fVar127 * -fVar127 * 0.5;
                  auVar148._4_4_ = fVar145;
                  auVar148._0_4_ = fVar145;
                  auVar148._8_4_ = fVar145;
                  auVar148._12_4_ = fVar145;
                  auVar8 = vfmadd132ps_fma(auVar148,auVar167,auVar170);
                  local_260 = auVar8._0_4_;
                  uStack_25c = local_260;
                  uStack_258 = local_260;
                  uStack_254 = local_260;
                  uStack_250 = local_260;
                  uStack_24c = local_260;
                  uStack_248 = local_260;
                  uStack_244 = local_260;
                  auVar167 = vmovshdup_avx(auVar8);
                  local_240 = auVar167._0_8_;
                  uStack_238 = local_240;
                  uStack_230 = local_240;
                  uStack_228 = local_240;
                  auVar167 = vshufps_avx(auVar8,auVar8,0xaa);
                  auVar149._0_8_ = auVar167._0_8_;
                  auVar149._8_8_ = auVar149._0_8_;
                  auVar157._16_8_ = auVar149._0_8_;
                  auVar157._0_16_ = auVar149;
                  auVar157._24_8_ = auVar149._0_8_;
                  local_220 = auVar157;
                  uStack_1dc = local_1e0;
                  uStack_1d8 = local_1e0;
                  uStack_1d4 = local_1e0;
                  uStack_1d0 = local_1e0;
                  uStack_1cc = local_1e0;
                  uStack_1c8 = local_1e0;
                  uStack_1c4 = local_1e0;
                  local_1c0 = local_6c0._0_8_;
                  uStack_1b8 = local_6c0._8_8_;
                  uStack_1b0 = local_6c0._16_8_;
                  uStack_1a8 = local_6c0._24_8_;
                  local_1a0 = local_920;
                  vpcmpeqd_avx2(local_920,local_920);
                  local_180 = (local_730.context)->instID[0];
                  uStack_17c = local_180;
                  uStack_178 = local_180;
                  uStack_174 = local_180;
                  uStack_170 = local_180;
                  uStack_16c = local_180;
                  uStack_168 = local_180;
                  uStack_164 = local_180;
                  local_160 = (local_730.context)->instPrimID[0];
                  uStack_15c = local_160;
                  uStack_158 = local_160;
                  uStack_154 = local_160;
                  uStack_150 = local_160;
                  uStack_14c = local_160;
                  uStack_148 = local_160;
                  uStack_144 = local_160;
                  local_640 = local_3e0;
                  local_730.valid = (int *)local_640;
                  local_730.geometryUserPtr = *(void **)(CONCAT44(uStack_5dc,local_5e0) + 0x18);
                  local_730.hit = (RTCHitN *)&local_260;
                  local_730.N = 8;
                  pcVar14 = *(code **)(CONCAT44(uStack_5dc,local_5e0) + 0x48);
                  local_730.ray = (RTCRayN *)ray;
                  if (pcVar14 != (code *)0x0) {
                    auVar157 = ZEXT1632(auVar149);
                    (*pcVar14)(&local_730);
                    auVar211 = ZEXT3264(_local_680);
                    auVar143 = ZEXT3264(local_6e0);
                    auVar191 = ZEXT3264(CONCAT428(fVar206,CONCAT424(fVar206,CONCAT420(fVar206,
                                                  CONCAT416(fVar206,CONCAT412(fVar206,CONCAT48(
                                                  fVar206,CONCAT44(fVar206,fVar206))))))));
                    auVar205 = ZEXT3264(auVar179);
                    auVar199 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  auVar141 = vpcmpeqd_avx2(auVar199._0_32_,local_640);
                  auVar123 = vpcmpeqd_avx2(auVar157,auVar157);
                  auVar117 = auVar123 & ~auVar141;
                  if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar117 >> 0x7f,0) == '\0') &&
                        (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar117 >> 0xbf,0) == '\0') &&
                      (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar117[0x1f]) {
                    auVar141 = auVar141 ^ auVar123;
                  }
                  else {
                    p_Var15 = context->args->filter;
                    if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(CONCAT44(uStack_5dc,local_5e0) + 0x3e) & 0x40) != 0)))) {
                      (*p_Var15)(&local_730);
                      auVar211 = ZEXT3264(_local_680);
                      auVar143 = ZEXT3264(local_6e0);
                      auVar191 = ZEXT3264(CONCAT428(fVar206,CONCAT424(fVar206,CONCAT420(fVar206,
                                                  CONCAT416(fVar206,CONCAT412(fVar206,CONCAT48(
                                                  fVar206,CONCAT44(fVar206,fVar206))))))));
                      auVar205 = ZEXT3264(auVar179);
                      auVar199 = ZEXT1664(ZEXT816(0) << 0x40);
                    }
                    auVar117 = vpcmpeqd_avx2(auVar199._0_32_,local_640);
                    auVar141 = vpcmpeqd_avx2(local_640,local_640);
                    auVar141 = auVar117 ^ auVar141;
                    auVar158._8_4_ = 0xff800000;
                    auVar158._0_8_ = 0xff800000ff800000;
                    auVar158._12_4_ = 0xff800000;
                    auVar158._16_4_ = 0xff800000;
                    auVar158._20_4_ = 0xff800000;
                    auVar158._24_4_ = 0xff800000;
                    auVar158._28_4_ = 0xff800000;
                    auVar117 = vblendvps_avx(auVar158,*(undefined1 (*) [32])(local_730.ray + 0x100),
                                             auVar117);
                    *(undefined1 (*) [32])(local_730.ray + 0x100) = auVar117;
                  }
                  auVar163 = auVar143._0_32_;
                  auVar185 = ZEXT3264(CONCAT428(fVar165,CONCAT424(fVar162,CONCAT420(fVar165,
                                                  CONCAT416(fVar162,CONCAT412(fVar165,CONCAT48(
                                                  fVar162,uVar113)))))));
                  if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar141 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar141 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar141 >> 0x7f,0) != '\0') ||
                        (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar141 >> 0xbf,0) != '\0') ||
                      (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar141[0x1f] < '\0') {
                    bVar107 = true;
                    break;
                  }
                  *(undefined4 *)(ray + k * 4 + 0x100) = local_5a0._0_4_;
                  uVar106 = uVar105 & 0x3f;
                  bVar107 = false;
                  uVar105 = 0;
                  local_940._0_8_ = local_940._0_8_ ^ 1L << uVar106;
                  for (uVar106 = local_940._0_8_; (uVar106 & 1) == 0;
                      uVar106 = uVar106 >> 1 | 0x8000000000000000) {
                    uVar105 = uVar105 + 1;
                  }
                } while (local_940._0_8_ != 0);
              }
            }
          }
        }
      }
      auVar217 = ZEXT3264(auVar220);
      auVar143 = ZEXT3264(local_6a0);
      auVar199 = ZEXT3264(local_700);
      if (8 < iVar104) {
        local_5c0._4_4_ = iVar104;
        local_5c0._0_4_ = iVar104;
        local_5c0._8_4_ = iVar104;
        local_5c0._12_4_ = iVar104;
        local_5c0._16_4_ = iVar104;
        local_5c0._20_4_ = iVar104;
        local_5c0._24_4_ = iVar104;
        local_5c0._28_4_ = iVar104;
        local_4a0._4_4_ = fVar146;
        local_4a0._0_4_ = fVar146;
        fStack_498 = fVar146;
        fStack_494 = fVar146;
        fStack_490 = fVar146;
        fStack_48c = fVar146;
        fStack_488 = fVar146;
        fStack_484 = fVar146;
        local_140 = 1.0 / (float)local_520._0_4_;
        fStack_13c = local_140;
        fStack_138 = local_140;
        fStack_134 = local_140;
        fStack_130 = local_140;
        fStack_12c = local_140;
        fStack_128 = local_140;
        fStack_124 = local_140;
        local_120 = local_920._4_4_;
        uStack_11c = local_920._4_4_;
        uStack_118 = local_920._4_4_;
        uStack_114 = local_920._4_4_;
        uStack_110 = local_920._4_4_;
        uStack_10c = local_920._4_4_;
        uStack_108 = local_920._4_4_;
        uStack_104 = local_920._4_4_;
        uStack_53c = local_540;
        uStack_538 = local_540;
        uStack_534 = local_540;
        uStack_530 = local_540;
        uStack_52c = local_540;
        uStack_528 = local_540;
        uStack_524 = local_540;
        lVar111 = 8;
        auVar117 = auVar205._0_32_;
        _local_680 = auVar211._0_32_;
        local_6e0 = auVar163;
        local_5e0 = uVar112;
        uStack_5dc = uVar112;
        uStack_5d8 = uVar112;
        uStack_5d4 = uVar112;
        uStack_5d0 = uVar112;
        uStack_5cc = uVar112;
        uStack_5c8 = uVar112;
        uStack_5c4 = uVar112;
        do {
          auVar152 = auVar199._0_32_;
          local_6a0 = auVar143._0_32_;
          auVar141 = *(undefined1 (*) [32])(bspline_basis0 + lVar111 * 4 + lVar21);
          auVar123 = *(undefined1 (*) [32])(lVar21 + 0x21aefac + lVar111 * 4);
          auVar179 = *(undefined1 (*) [32])(lVar21 + 0x21af430 + lVar111 * 4);
          pauVar2 = (undefined1 (*) [32])(lVar21 + 0x21af8b4 + lVar111 * 4);
          fVar131 = *(float *)*pauVar2;
          fVar89 = *(float *)(*pauVar2 + 4);
          fVar90 = *(float *)(*pauVar2 + 8);
          fVar91 = *(float *)(*pauVar2 + 0xc);
          fVar92 = *(float *)(*pauVar2 + 0x10);
          fVar93 = *(float *)(*pauVar2 + 0x14);
          fVar94 = *(float *)(*pauVar2 + 0x18);
          auVar102 = *(undefined1 (*) [28])*pauVar2;
          auVar210._0_4_ = fVar131 * auVar191._0_4_;
          auVar210._4_4_ = fVar89 * auVar191._4_4_;
          auVar210._8_4_ = fVar90 * auVar191._8_4_;
          auVar210._12_4_ = fVar91 * auVar191._12_4_;
          auVar210._16_4_ = fVar92 * auVar191._16_4_;
          auVar210._20_4_ = fVar93 * auVar191._20_4_;
          auVar210._28_36_ = auVar211._28_36_;
          auVar210._24_4_ = fVar94 * auVar191._24_4_;
          auVar211._0_4_ = fVar131 * auVar185._0_4_;
          auVar211._4_4_ = fVar89 * auVar185._4_4_;
          auVar211._8_4_ = fVar90 * auVar185._8_4_;
          auVar211._12_4_ = fVar91 * auVar185._12_4_;
          auVar211._16_4_ = fVar92 * auVar185._16_4_;
          auVar211._20_4_ = fVar93 * auVar185._20_4_;
          auVar211._28_36_ = auVar143._28_36_;
          auVar211._24_4_ = fVar94 * auVar185._24_4_;
          auVar170 = vfmadd231ps_fma(auVar210._0_32_,auVar179,auVar154);
          auVar167 = vfmadd231ps_fma(auVar211._0_32_,auVar179,auVar203);
          auVar170 = vfmadd231ps_fma(ZEXT1632(auVar170),auVar123,auVar200);
          auVar153 = auVar217._0_32_;
          auVar167 = vfmadd231ps_fma(ZEXT1632(auVar167),auVar123,auVar153);
          auVar170 = vfmadd231ps_fma(ZEXT1632(auVar170),auVar141,auVar216);
          auVar167 = vfmadd231ps_fma(ZEXT1632(auVar167),auVar141,local_580);
          auVar159 = *(undefined1 (*) [32])(bspline_basis1 + lVar111 * 4 + lVar21);
          auVar18 = *(undefined1 (*) [32])(lVar21 + 0x21b13cc + lVar111 * 4);
          auVar19 = *(undefined1 (*) [32])(lVar21 + 0x21b1850 + lVar111 * 4);
          pfVar3 = (float *)(lVar21 + 0x21b1cd4 + lVar111 * 4);
          fVar132 = *pfVar3;
          fVar144 = pfVar3[1];
          fVar95 = pfVar3[2];
          fVar96 = pfVar3[3];
          fVar97 = pfVar3[4];
          fVar98 = pfVar3[5];
          fVar99 = pfVar3[6];
          auVar192._0_4_ = fVar132 * auVar191._0_4_;
          auVar192._4_4_ = fVar144 * auVar191._4_4_;
          auVar192._8_4_ = fVar95 * auVar191._8_4_;
          auVar192._12_4_ = fVar96 * auVar191._12_4_;
          auVar192._16_4_ = fVar97 * auVar191._16_4_;
          auVar192._20_4_ = fVar98 * auVar191._20_4_;
          auVar192._28_36_ = auVar191._28_36_;
          auVar192._24_4_ = fVar99 * auVar191._24_4_;
          auVar58._4_4_ = fVar144 * auVar185._4_4_;
          auVar58._0_4_ = fVar132 * auVar185._0_4_;
          auVar58._8_4_ = fVar95 * auVar185._8_4_;
          auVar58._12_4_ = fVar96 * auVar185._12_4_;
          auVar58._16_4_ = fVar97 * auVar185._16_4_;
          auVar58._20_4_ = fVar98 * auVar185._20_4_;
          auVar58._24_4_ = fVar99 * auVar185._24_4_;
          auVar58._28_4_ = auVar141._28_4_;
          auVar8 = vfmadd231ps_fma(auVar192._0_32_,auVar19,auVar154);
          auVar9 = vfmadd231ps_fma(auVar58,auVar19,auVar203);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar18,auVar200);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar18,auVar153);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar159,auVar216);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar159,local_580);
          local_460 = ZEXT1632(auVar8);
          local_420 = ZEXT1632(auVar170);
          auVar20 = vsubps_avx(local_460,local_420);
          local_5a0 = ZEXT1632(auVar9);
          auVar134 = ZEXT1632(auVar167);
          local_440 = vsubps_avx(local_5a0,auVar134);
          auVar59._4_4_ = auVar20._4_4_ * auVar167._4_4_;
          auVar59._0_4_ = auVar20._0_4_ * auVar167._0_4_;
          auVar59._8_4_ = auVar20._8_4_ * auVar167._8_4_;
          auVar59._12_4_ = auVar20._12_4_ * auVar167._12_4_;
          auVar59._16_4_ = auVar20._16_4_ * 0.0;
          auVar59._20_4_ = auVar20._20_4_ * 0.0;
          auVar59._24_4_ = auVar20._24_4_ * 0.0;
          auVar59._28_4_ = auVar217._28_4_;
          fVar146 = local_440._0_4_;
          auVar140._0_4_ = auVar170._0_4_ * fVar146;
          fVar145 = local_440._4_4_;
          auVar140._4_4_ = auVar170._4_4_ * fVar145;
          fVar126 = local_440._8_4_;
          auVar140._8_4_ = auVar170._8_4_ * fVar126;
          fVar127 = local_440._12_4_;
          auVar140._12_4_ = auVar170._12_4_ * fVar127;
          fVar128 = local_440._16_4_;
          auVar140._16_4_ = fVar128 * 0.0;
          fVar129 = local_440._20_4_;
          auVar140._20_4_ = fVar129 * 0.0;
          fVar130 = local_440._24_4_;
          auVar140._24_4_ = fVar130 * 0.0;
          auVar140._28_4_ = 0;
          auVar211 = ZEXT3264(auVar179);
          auVar125 = vsubps_avx(auVar59,auVar140);
          auVar143._0_4_ = fVar131 * (float)local_100;
          auVar143._4_4_ = fVar89 * local_100._4_4_;
          auVar143._8_4_ = fVar90 * (float)uStack_f8;
          auVar143._12_4_ = fVar91 * uStack_f8._4_4_;
          auVar143._16_4_ = fVar92 * (float)uStack_f0;
          auVar143._20_4_ = fVar93 * uStack_f0._4_4_;
          auVar143._28_36_ = auVar185._28_36_;
          auVar143._24_4_ = fVar94 * (float)uStack_e8;
          auVar170 = vfmadd231ps_fma(auVar143._0_32_,auVar179,local_e0);
          auVar170 = vfmadd231ps_fma(ZEXT1632(auVar170),local_c0,auVar123);
          auVar170 = vfmadd231ps_fma(ZEXT1632(auVar170),local_a0,auVar141);
          auVar60._4_4_ = fVar144 * local_100._4_4_;
          auVar60._0_4_ = fVar132 * (float)local_100;
          auVar60._8_4_ = fVar95 * (float)uStack_f8;
          auVar60._12_4_ = fVar96 * uStack_f8._4_4_;
          auVar60._16_4_ = fVar97 * (float)uStack_f0;
          auVar60._20_4_ = fVar98 * uStack_f0._4_4_;
          auVar60._24_4_ = fVar99 * (float)uStack_e8;
          auVar60._28_4_ = uStack_e8._4_4_;
          auVar8 = vfmadd231ps_fma(auVar60,auVar19,local_e0);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar18,local_c0);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar159,local_a0);
          auVar61._4_4_ = fVar145 * fVar145;
          auVar61._0_4_ = fVar146 * fVar146;
          auVar61._8_4_ = fVar126 * fVar126;
          auVar61._12_4_ = fVar127 * fVar127;
          auVar61._16_4_ = fVar128 * fVar128;
          auVar61._20_4_ = fVar129 * fVar129;
          auVar61._24_4_ = fVar130 * fVar130;
          auVar61._28_4_ = local_a0._28_4_;
          auVar9 = vfmadd231ps_fma(auVar61,auVar20,auVar20);
          auVar193 = vmaxps_avx(ZEXT1632(auVar170),ZEXT1632(auVar8));
          auVar197._0_4_ = auVar193._0_4_ * auVar193._0_4_ * auVar9._0_4_;
          auVar197._4_4_ = auVar193._4_4_ * auVar193._4_4_ * auVar9._4_4_;
          auVar197._8_4_ = auVar193._8_4_ * auVar193._8_4_ * auVar9._8_4_;
          auVar197._12_4_ = auVar193._12_4_ * auVar193._12_4_ * auVar9._12_4_;
          auVar197._16_4_ = auVar193._16_4_ * auVar193._16_4_ * 0.0;
          auVar197._20_4_ = auVar193._20_4_ * auVar193._20_4_ * 0.0;
          auVar197._24_4_ = auVar193._24_4_ * auVar193._24_4_ * 0.0;
          auVar197._28_4_ = 0;
          auVar62._4_4_ = auVar125._4_4_ * auVar125._4_4_;
          auVar62._0_4_ = auVar125._0_4_ * auVar125._0_4_;
          auVar62._8_4_ = auVar125._8_4_ * auVar125._8_4_;
          auVar62._12_4_ = auVar125._12_4_ * auVar125._12_4_;
          auVar62._16_4_ = auVar125._16_4_ * auVar125._16_4_;
          auVar62._20_4_ = auVar125._20_4_ * auVar125._20_4_;
          auVar62._24_4_ = auVar125._24_4_ * auVar125._24_4_;
          auVar62._28_4_ = auVar125._28_4_;
          auVar193 = vcmpps_avx(auVar62,auVar197,2);
          local_340 = (int)lVar111;
          auVar198._4_4_ = local_340;
          auVar198._0_4_ = local_340;
          auVar198._8_4_ = local_340;
          auVar198._12_4_ = local_340;
          auVar198._16_4_ = local_340;
          auVar198._20_4_ = local_340;
          auVar198._24_4_ = local_340;
          auVar198._28_4_ = local_340;
          auVar125 = vpor_avx2(auVar198,_DAT_01fe9900);
          auVar17 = vpcmpgtd_avx2(local_5c0,auVar125);
          auVar125 = auVar17 & auVar193;
          if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar125 >> 0x7f,0) == '\0') &&
                (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar125 >> 0xbf,0) == '\0') &&
              (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar125[0x1f]) {
            auVar143 = ZEXT3264(local_6a0);
            auVar199 = ZEXT3264(auVar152);
            auVar217 = ZEXT3264(auVar153);
            auVar191 = ZEXT3264(CONCAT428(fVar206,CONCAT424(fVar206,CONCAT420(fVar206,CONCAT416(
                                                  fVar206,CONCAT412(fVar206,CONCAT48(fVar206,
                                                  CONCAT44(fVar206,fVar206))))))));
            auVar185 = ZEXT3264(CONCAT428(fVar165,CONCAT424(fVar162,CONCAT420(fVar165,CONCAT416(
                                                  fVar162,CONCAT412(fVar165,CONCAT48(fVar162,uVar113
                                                                                    )))))));
          }
          else {
            local_520 = vandps_avx(auVar17,auVar193);
            auVar63._4_4_ = fVar144 * (float)local_680._4_4_;
            auVar63._0_4_ = fVar132 * (float)local_680._0_4_;
            auVar63._8_4_ = fVar95 * fStack_678;
            auVar63._12_4_ = fVar96 * fStack_674;
            auVar63._16_4_ = fVar97 * fStack_670;
            auVar63._20_4_ = fVar98 * fStack_66c;
            auVar63._24_4_ = fVar99 * fStack_668;
            auVar63._28_4_ = auVar193._28_4_;
            auVar9 = vfmadd213ps_fma(auVar19,local_500,auVar63);
            auVar9 = vfmadd213ps_fma(auVar18,local_6e0,ZEXT1632(auVar9));
            auVar9 = vfmadd132ps_fma(auVar159,ZEXT1632(auVar9),local_660);
            local_480._0_4_ = auVar102._0_4_;
            local_480._4_4_ = auVar102._4_4_;
            fStack_478 = auVar102._8_4_;
            fStack_474 = auVar102._12_4_;
            fStack_470 = auVar102._16_4_;
            fStack_46c = auVar102._20_4_;
            fStack_468 = auVar102._24_4_;
            auVar64._4_4_ = (float)local_680._4_4_ * (float)local_480._4_4_;
            auVar64._0_4_ = (float)local_680._0_4_ * (float)local_480._0_4_;
            auVar64._8_4_ = fStack_678 * fStack_478;
            auVar64._12_4_ = fStack_674 * fStack_474;
            auVar64._16_4_ = fStack_670 * fStack_470;
            auVar64._20_4_ = fStack_66c * fStack_46c;
            auVar64._24_4_ = fStack_668 * fStack_468;
            auVar64._28_4_ = auVar193._28_4_;
            auVar10 = vfmadd213ps_fma(auVar179,local_500,auVar64);
            auVar10 = vfmadd213ps_fma(auVar123,local_6e0,ZEXT1632(auVar10));
            auVar123 = *(undefined1 (*) [32])(lVar21 + 0x21afd38 + lVar111 * 4);
            auVar179 = *(undefined1 (*) [32])(lVar21 + 0x21b01bc + lVar111 * 4);
            auVar159 = *(undefined1 (*) [32])(lVar21 + 0x21b0640 + lVar111 * 4);
            pfVar3 = (float *)(lVar21 + 0x21b0ac4 + lVar111 * 4);
            fVar146 = *pfVar3;
            fVar145 = pfVar3[1];
            fVar126 = pfVar3[2];
            fVar127 = pfVar3[3];
            fVar128 = pfVar3[4];
            fVar129 = pfVar3[5];
            fVar130 = pfVar3[6];
            auVar65._4_4_ = fVar206 * fVar145;
            auVar65._0_4_ = fVar206 * fVar146;
            auVar65._8_4_ = fVar206 * fVar126;
            auVar65._12_4_ = fVar206 * fVar127;
            auVar65._16_4_ = fVar206 * fVar128;
            auVar65._20_4_ = fVar206 * fVar129;
            auVar65._24_4_ = fVar206 * fVar130;
            auVar65._28_4_ = auVar20._28_4_;
            auVar208._0_4_ = fVar162 * fVar146;
            auVar208._4_4_ = fVar165 * fVar145;
            auVar208._8_4_ = fVar162 * fVar126;
            auVar208._12_4_ = fVar165 * fVar127;
            auVar208._16_4_ = fVar162 * fVar128;
            auVar208._20_4_ = fVar165 * fVar129;
            auVar208._24_4_ = fVar162 * fVar130;
            auVar208._28_4_ = 0;
            auVar66._4_4_ = fVar145 * (float)local_680._4_4_;
            auVar66._0_4_ = fVar146 * (float)local_680._0_4_;
            auVar66._8_4_ = fVar126 * fStack_678;
            auVar66._12_4_ = fVar127 * fStack_674;
            auVar66._16_4_ = fVar128 * fStack_670;
            auVar66._20_4_ = fVar129 * fStack_66c;
            auVar66._24_4_ = fVar130 * fStack_668;
            auVar66._28_4_ = pfVar3[7];
            auVar11 = vfmadd231ps_fma(auVar65,auVar159,auVar154);
            auVar114 = vfmadd231ps_fma(auVar208,auVar159,auVar203);
            auVar187 = vfmadd231ps_fma(auVar66,local_500,auVar159);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar179,auVar200);
            auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar179,auVar220);
            auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar179,local_6e0);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar123,auVar216);
            auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar123,local_580);
            auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar123,local_660);
            pfVar3 = (float *)(lVar21 + 0x21b2ee4 + lVar111 * 4);
            fVar146 = *pfVar3;
            fVar145 = pfVar3[1];
            fVar126 = pfVar3[2];
            fVar127 = pfVar3[3];
            fVar128 = pfVar3[4];
            fVar129 = pfVar3[5];
            fVar130 = pfVar3[6];
            auVar67._4_4_ = fVar206 * fVar145;
            auVar67._0_4_ = fVar206 * fVar146;
            auVar67._8_4_ = fVar206 * fVar126;
            auVar67._12_4_ = fVar206 * fVar127;
            auVar67._16_4_ = fVar206 * fVar128;
            auVar67._20_4_ = fVar206 * fVar129;
            auVar67._24_4_ = fVar206 * fVar130;
            auVar67._28_4_ = fVar206;
            auVar68._4_4_ = fVar165 * fVar145;
            auVar68._0_4_ = fVar162 * fVar146;
            auVar68._8_4_ = fVar162 * fVar126;
            auVar68._12_4_ = fVar165 * fVar127;
            auVar68._16_4_ = fVar162 * fVar128;
            auVar68._20_4_ = fVar165 * fVar129;
            auVar68._24_4_ = fVar162 * fVar130;
            auVar68._28_4_ = fVar165;
            auVar69._4_4_ = (float)local_680._4_4_ * fVar145;
            auVar69._0_4_ = (float)local_680._0_4_ * fVar146;
            auVar69._8_4_ = fStack_678 * fVar126;
            auVar69._12_4_ = fStack_674 * fVar127;
            auVar69._16_4_ = fStack_670 * fVar128;
            auVar69._20_4_ = fStack_66c * fVar129;
            auVar69._24_4_ = fStack_668 * fVar130;
            auVar69._28_4_ = pfVar3[7];
            auVar123 = *(undefined1 (*) [32])(lVar21 + 0x21b2a60 + lVar111 * 4);
            auVar166 = vfmadd231ps_fma(auVar67,auVar123,auVar154);
            auVar180 = vfmadd231ps_fma(auVar68,auVar123,auVar203);
            auVar23 = vfmadd231ps_fma(auVar69,local_500,auVar123);
            auVar123 = *(undefined1 (*) [32])(lVar21 + 0x21b25dc + lVar111 * 4);
            auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar123,auVar200);
            auVar180 = vfmadd231ps_fma(ZEXT1632(auVar180),auVar123,auVar220);
            auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar123,local_6e0);
            auVar123 = *(undefined1 (*) [32])(lVar21 + 0x21b2158 + lVar111 * 4);
            auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar123,auVar216);
            auVar180 = vfmadd231ps_fma(ZEXT1632(auVar180),auVar123,local_580);
            auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),local_660,auVar123);
            auVar123 = vandps_avx(ZEXT1632(auVar11),local_3c0);
            auVar179 = vandps_avx(ZEXT1632(auVar114),local_3c0);
            auVar179 = vmaxps_avx(auVar123,auVar179);
            auVar123 = vandps_avx(ZEXT1632(auVar187),local_3c0);
            auVar123 = vmaxps_avx(auVar179,auVar123);
            auVar123 = vcmpps_avx(auVar123,_local_4a0,1);
            auVar159 = vblendvps_avx(ZEXT1632(auVar11),auVar20,auVar123);
            auVar18 = vblendvps_avx(ZEXT1632(auVar114),local_440,auVar123);
            auVar123 = vandps_avx(ZEXT1632(auVar166),local_3c0);
            auVar179 = vandps_avx(ZEXT1632(auVar180),local_3c0);
            auVar179 = vmaxps_avx(auVar123,auVar179);
            auVar123 = vandps_avx(local_3c0,ZEXT1632(auVar23));
            auVar123 = vmaxps_avx(auVar179,auVar123);
            auVar179 = vcmpps_avx(auVar123,_local_4a0,1);
            auVar123 = vblendvps_avx(ZEXT1632(auVar166),auVar20,auVar179);
            auVar179 = vblendvps_avx(ZEXT1632(auVar180),local_440,auVar179);
            auVar10 = vfmadd213ps_fma(auVar141,local_660,ZEXT1632(auVar10));
            auVar11 = vfmadd213ps_fma(auVar159,auVar159,ZEXT832(0) << 0x20);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar18,auVar18);
            auVar141 = vrsqrtps_avx(ZEXT1632(auVar11));
            fVar146 = auVar141._0_4_;
            fVar145 = auVar141._4_4_;
            fVar126 = auVar141._8_4_;
            fVar127 = auVar141._12_4_;
            fVar128 = auVar141._16_4_;
            fVar129 = auVar141._20_4_;
            fVar130 = auVar141._24_4_;
            auVar70._4_4_ = fVar145 * fVar145 * fVar145 * auVar11._4_4_ * -0.5;
            auVar70._0_4_ = fVar146 * fVar146 * fVar146 * auVar11._0_4_ * -0.5;
            auVar70._8_4_ = fVar126 * fVar126 * fVar126 * auVar11._8_4_ * -0.5;
            auVar70._12_4_ = fVar127 * fVar127 * fVar127 * auVar11._12_4_ * -0.5;
            auVar70._16_4_ = fVar128 * fVar128 * fVar128 * -0.0;
            auVar70._20_4_ = fVar129 * fVar129 * fVar129 * -0.0;
            auVar70._24_4_ = fVar130 * fVar130 * fVar130 * -0.0;
            auVar70._28_4_ = 0;
            auVar174._8_4_ = 0x3fc00000;
            auVar174._0_8_ = 0x3fc000003fc00000;
            auVar174._12_4_ = 0x3fc00000;
            auVar174._16_4_ = 0x3fc00000;
            auVar174._20_4_ = 0x3fc00000;
            auVar174._24_4_ = 0x3fc00000;
            auVar174._28_4_ = 0x3fc00000;
            auVar11 = vfmadd231ps_fma(auVar70,auVar174,auVar141);
            fVar146 = auVar11._0_4_;
            fVar145 = auVar11._4_4_;
            auVar71._4_4_ = auVar18._4_4_ * fVar145;
            auVar71._0_4_ = auVar18._0_4_ * fVar146;
            fVar126 = auVar11._8_4_;
            auVar71._8_4_ = auVar18._8_4_ * fVar126;
            fVar127 = auVar11._12_4_;
            auVar71._12_4_ = auVar18._12_4_ * fVar127;
            auVar71._16_4_ = auVar18._16_4_ * 0.0;
            auVar71._20_4_ = auVar18._20_4_ * 0.0;
            auVar71._24_4_ = auVar18._24_4_ * 0.0;
            auVar71._28_4_ = auVar18._28_4_;
            auVar72._4_4_ = fVar145 * -auVar159._4_4_;
            auVar72._0_4_ = fVar146 * -auVar159._0_4_;
            auVar72._8_4_ = fVar126 * -auVar159._8_4_;
            auVar72._12_4_ = fVar127 * -auVar159._12_4_;
            auVar72._16_4_ = -auVar159._16_4_ * 0.0;
            auVar72._20_4_ = -auVar159._20_4_ * 0.0;
            auVar72._24_4_ = -auVar159._24_4_ * 0.0;
            auVar72._28_4_ = auVar141._28_4_;
            auVar11 = vfmadd213ps_fma(auVar123,auVar123,ZEXT832(0) << 0x20);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar179,auVar179);
            auVar141 = vrsqrtps_avx(ZEXT1632(auVar11));
            auVar73._28_4_ = auVar20._28_4_;
            auVar73._0_28_ =
                 ZEXT1628(CONCAT412(fVar127 * 0.0,
                                    CONCAT48(fVar126 * 0.0,CONCAT44(fVar145 * 0.0,fVar146 * 0.0))));
            fVar146 = auVar141._0_4_;
            fVar145 = auVar141._4_4_;
            fVar126 = auVar141._8_4_;
            fVar127 = auVar141._12_4_;
            fVar128 = auVar141._16_4_;
            fVar129 = auVar141._20_4_;
            fVar130 = auVar141._24_4_;
            auVar74._4_4_ = fVar145 * fVar145 * fVar145 * auVar11._4_4_ * -0.5;
            auVar74._0_4_ = fVar146 * fVar146 * fVar146 * auVar11._0_4_ * -0.5;
            auVar74._8_4_ = fVar126 * fVar126 * fVar126 * auVar11._8_4_ * -0.5;
            auVar74._12_4_ = fVar127 * fVar127 * fVar127 * auVar11._12_4_ * -0.5;
            auVar74._16_4_ = fVar128 * fVar128 * fVar128 * -0.0;
            auVar74._20_4_ = fVar129 * fVar129 * fVar129 * -0.0;
            auVar74._24_4_ = fVar130 * fVar130 * fVar130 * -0.0;
            auVar74._28_4_ = 0;
            auVar11 = vfmadd231ps_fma(auVar74,auVar174,auVar141);
            fVar146 = auVar11._0_4_;
            fVar145 = auVar11._4_4_;
            auVar75._4_4_ = auVar179._4_4_ * fVar145;
            auVar75._0_4_ = auVar179._0_4_ * fVar146;
            fVar126 = auVar11._8_4_;
            auVar75._8_4_ = auVar179._8_4_ * fVar126;
            fVar127 = auVar11._12_4_;
            auVar75._12_4_ = auVar179._12_4_ * fVar127;
            auVar75._16_4_ = auVar179._16_4_ * 0.0;
            auVar75._20_4_ = auVar179._20_4_ * 0.0;
            auVar75._24_4_ = auVar179._24_4_ * 0.0;
            auVar75._28_4_ = 0;
            auVar76._4_4_ = fVar145 * -auVar123._4_4_;
            auVar76._0_4_ = fVar146 * -auVar123._0_4_;
            auVar76._8_4_ = fVar126 * -auVar123._8_4_;
            auVar76._12_4_ = fVar127 * -auVar123._12_4_;
            auVar76._16_4_ = -auVar123._16_4_ * 0.0;
            auVar76._20_4_ = -auVar123._20_4_ * 0.0;
            auVar76._24_4_ = -auVar123._24_4_ * 0.0;
            auVar76._28_4_ = 0;
            auVar77._28_4_ = 0xbf000000;
            auVar77._0_28_ =
                 ZEXT1628(CONCAT412(fVar127 * 0.0,
                                    CONCAT48(fVar126 * 0.0,CONCAT44(fVar145 * 0.0,fVar146 * 0.0))));
            auVar11 = vfmadd213ps_fma(auVar71,ZEXT1632(auVar170),local_420);
            auVar141 = ZEXT1632(auVar170);
            auVar114 = vfmadd213ps_fma(auVar72,auVar141,auVar134);
            auVar187 = vfmadd213ps_fma(auVar73,auVar141,ZEXT1632(auVar10));
            auVar181 = vfnmadd213ps_fma(auVar71,auVar141,local_420);
            auVar166 = vfmadd213ps_fma(auVar75,ZEXT1632(auVar8),local_460);
            auVar188 = vfnmadd213ps_fma(auVar72,auVar141,auVar134);
            auVar141 = ZEXT1632(auVar8);
            auVar180 = vfmadd213ps_fma(auVar76,auVar141,local_5a0);
            auVar182 = ZEXT1632(auVar170);
            auVar202 = vfnmadd231ps_fma(ZEXT1632(auVar10),auVar182,auVar73);
            auVar10 = vfmadd213ps_fma(auVar77,auVar141,ZEXT1632(auVar9));
            auVar189 = vfnmadd213ps_fma(auVar75,auVar141,local_460);
            auVar195 = vfnmadd213ps_fma(auVar76,auVar141,local_5a0);
            auVar207 = vfnmadd231ps_fma(ZEXT1632(auVar9),ZEXT1632(auVar8),auVar77);
            auVar141 = vsubps_avx(ZEXT1632(auVar180),ZEXT1632(auVar188));
            auVar123 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar202));
            auVar183._0_4_ = auVar141._0_4_ * auVar202._0_4_;
            auVar183._4_4_ = auVar141._4_4_ * auVar202._4_4_;
            auVar183._8_4_ = auVar141._8_4_ * auVar202._8_4_;
            auVar183._12_4_ = auVar141._12_4_ * auVar202._12_4_;
            auVar183._16_4_ = auVar141._16_4_ * 0.0;
            auVar183._20_4_ = auVar141._20_4_ * 0.0;
            auVar183._24_4_ = auVar141._24_4_ * 0.0;
            auVar183._28_4_ = 0;
            auVar23 = vfmsub231ps_fma(auVar183,ZEXT1632(auVar188),auVar123);
            auVar78._4_4_ = auVar181._4_4_ * auVar123._4_4_;
            auVar78._0_4_ = auVar181._0_4_ * auVar123._0_4_;
            auVar78._8_4_ = auVar181._8_4_ * auVar123._8_4_;
            auVar78._12_4_ = auVar181._12_4_ * auVar123._12_4_;
            auVar78._16_4_ = auVar123._16_4_ * 0.0;
            auVar78._20_4_ = auVar123._20_4_ * 0.0;
            auVar78._24_4_ = auVar123._24_4_ * 0.0;
            auVar78._28_4_ = auVar123._28_4_;
            auVar193 = ZEXT1632(auVar181);
            auVar123 = vsubps_avx(ZEXT1632(auVar166),auVar193);
            auVar125 = ZEXT1632(auVar202);
            auVar9 = vfmsub231ps_fma(auVar78,auVar125,auVar123);
            auVar79._4_4_ = auVar188._4_4_ * auVar123._4_4_;
            auVar79._0_4_ = auVar188._0_4_ * auVar123._0_4_;
            auVar79._8_4_ = auVar188._8_4_ * auVar123._8_4_;
            auVar79._12_4_ = auVar188._12_4_ * auVar123._12_4_;
            auVar79._16_4_ = auVar123._16_4_ * 0.0;
            auVar79._20_4_ = auVar123._20_4_ * 0.0;
            auVar79._24_4_ = auVar123._24_4_ * 0.0;
            auVar79._28_4_ = auVar123._28_4_;
            auVar181 = vfmsub231ps_fma(auVar79,auVar193,auVar141);
            auVar9 = vfmadd231ps_fma(ZEXT1632(auVar181),ZEXT832(0) << 0x20,ZEXT1632(auVar9));
            auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),ZEXT832(0) << 0x20,ZEXT1632(auVar23));
            auVar17 = vcmpps_avx(ZEXT1632(auVar9),ZEXT832(0) << 0x20,2);
            auVar141 = vblendvps_avx(ZEXT1632(auVar189),ZEXT1632(auVar11),auVar17);
            auVar123 = vblendvps_avx(ZEXT1632(auVar195),ZEXT1632(auVar114),auVar17);
            auVar179 = vblendvps_avx(ZEXT1632(auVar207),ZEXT1632(auVar187),auVar17);
            auVar159 = vblendvps_avx(auVar193,ZEXT1632(auVar166),auVar17);
            auVar18 = vblendvps_avx(ZEXT1632(auVar188),ZEXT1632(auVar180),auVar17);
            auVar19 = vblendvps_avx(auVar125,ZEXT1632(auVar10),auVar17);
            auVar193 = vblendvps_avx(ZEXT1632(auVar166),auVar193,auVar17);
            auVar20 = vblendvps_avx(ZEXT1632(auVar180),ZEXT1632(auVar188),auVar17);
            auVar9 = vpackssdw_avx(local_520._0_16_,local_520._16_16_);
            auVar125 = vblendvps_avx(ZEXT1632(auVar10),auVar125,auVar17);
            auVar193 = vsubps_avx(auVar193,auVar141);
            auVar20 = vsubps_avx(auVar20,auVar123);
            auVar134 = vsubps_avx(auVar125,auVar179);
            auVar153 = vsubps_avx(auVar141,auVar159);
            auVar175 = vsubps_avx(auVar123,auVar18);
            auVar190 = vsubps_avx(auVar179,auVar19);
            auVar176._0_4_ = auVar134._0_4_ * auVar141._0_4_;
            auVar176._4_4_ = auVar134._4_4_ * auVar141._4_4_;
            auVar176._8_4_ = auVar134._8_4_ * auVar141._8_4_;
            auVar176._12_4_ = auVar134._12_4_ * auVar141._12_4_;
            auVar176._16_4_ = auVar134._16_4_ * auVar141._16_4_;
            auVar176._20_4_ = auVar134._20_4_ * auVar141._20_4_;
            auVar176._24_4_ = auVar134._24_4_ * auVar141._24_4_;
            auVar176._28_4_ = 0;
            auVar10 = vfmsub231ps_fma(auVar176,auVar179,auVar193);
            auVar80._4_4_ = auVar193._4_4_ * auVar123._4_4_;
            auVar80._0_4_ = auVar193._0_4_ * auVar123._0_4_;
            auVar80._8_4_ = auVar193._8_4_ * auVar123._8_4_;
            auVar80._12_4_ = auVar193._12_4_ * auVar123._12_4_;
            auVar80._16_4_ = auVar193._16_4_ * auVar123._16_4_;
            auVar80._20_4_ = auVar193._20_4_ * auVar123._20_4_;
            auVar80._24_4_ = auVar193._24_4_ * auVar123._24_4_;
            auVar80._28_4_ = auVar125._28_4_;
            auVar11 = vfmsub231ps_fma(auVar80,auVar141,auVar20);
            auVar211 = ZEXT864(0) << 0x20;
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar10));
            auVar177._0_4_ = auVar20._0_4_ * auVar179._0_4_;
            auVar177._4_4_ = auVar20._4_4_ * auVar179._4_4_;
            auVar177._8_4_ = auVar20._8_4_ * auVar179._8_4_;
            auVar177._12_4_ = auVar20._12_4_ * auVar179._12_4_;
            auVar177._16_4_ = auVar20._16_4_ * auVar179._16_4_;
            auVar177._20_4_ = auVar20._20_4_ * auVar179._20_4_;
            auVar177._24_4_ = auVar20._24_4_ * auVar179._24_4_;
            auVar177._28_4_ = 0;
            auVar11 = vfmsub231ps_fma(auVar177,auVar123,auVar134);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
            auVar178._0_4_ = auVar190._0_4_ * auVar159._0_4_;
            auVar178._4_4_ = auVar190._4_4_ * auVar159._4_4_;
            auVar178._8_4_ = auVar190._8_4_ * auVar159._8_4_;
            auVar178._12_4_ = auVar190._12_4_ * auVar159._12_4_;
            auVar178._16_4_ = auVar190._16_4_ * auVar159._16_4_;
            auVar178._20_4_ = auVar190._20_4_ * auVar159._20_4_;
            auVar178._24_4_ = auVar190._24_4_ * auVar159._24_4_;
            auVar178._28_4_ = 0;
            auVar10 = vfmsub231ps_fma(auVar178,auVar153,auVar19);
            auVar81._4_4_ = auVar175._4_4_ * auVar19._4_4_;
            auVar81._0_4_ = auVar175._0_4_ * auVar19._0_4_;
            auVar81._8_4_ = auVar175._8_4_ * auVar19._8_4_;
            auVar81._12_4_ = auVar175._12_4_ * auVar19._12_4_;
            auVar81._16_4_ = auVar175._16_4_ * auVar19._16_4_;
            auVar81._20_4_ = auVar175._20_4_ * auVar19._20_4_;
            auVar81._24_4_ = auVar175._24_4_ * auVar19._24_4_;
            auVar81._28_4_ = auVar19._28_4_;
            auVar114 = vfmsub231ps_fma(auVar81,auVar18,auVar190);
            auVar82._4_4_ = auVar153._4_4_ * auVar18._4_4_;
            auVar82._0_4_ = auVar153._0_4_ * auVar18._0_4_;
            auVar82._8_4_ = auVar153._8_4_ * auVar18._8_4_;
            auVar82._12_4_ = auVar153._12_4_ * auVar18._12_4_;
            auVar82._16_4_ = auVar153._16_4_ * auVar18._16_4_;
            auVar82._20_4_ = auVar153._20_4_ * auVar18._20_4_;
            auVar82._24_4_ = auVar153._24_4_ * auVar18._24_4_;
            auVar82._28_4_ = auVar18._28_4_;
            auVar187 = vfmsub231ps_fma(auVar82,auVar175,auVar159);
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar187),ZEXT832(0) << 0x20,ZEXT1632(auVar10));
            auVar114 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT832(0) << 0x20,ZEXT1632(auVar114));
            auVar159 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar114));
            auVar159 = vcmpps_avx(auVar159,ZEXT832(0) << 0x20,2);
            auVar10 = vpackssdw_avx(auVar159._0_16_,auVar159._16_16_);
            auVar10 = vpand_avx(auVar10,auVar9);
            auVar159 = vpmovsxwd_avx2(auVar10);
            if ((((((((auVar159 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar159 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar159 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar159 >> 0x7f,0) == '\0') &&
                  (auVar159 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar159 >> 0xbf,0) == '\0') &&
                (auVar159 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar159[0x1f]) {
              auVar185 = ZEXT3264(CONCAT824(uStack_5e8,
                                            CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
              auVar199 = ZEXT3264(auVar152);
            }
            else {
              auVar83._4_4_ = auVar20._4_4_ * auVar190._4_4_;
              auVar83._0_4_ = auVar20._0_4_ * auVar190._0_4_;
              auVar83._8_4_ = auVar20._8_4_ * auVar190._8_4_;
              auVar83._12_4_ = auVar20._12_4_ * auVar190._12_4_;
              auVar83._16_4_ = auVar20._16_4_ * auVar190._16_4_;
              auVar83._20_4_ = auVar20._20_4_ * auVar190._20_4_;
              auVar83._24_4_ = auVar20._24_4_ * auVar190._24_4_;
              auVar83._28_4_ = auVar159._28_4_;
              auVar23 = vfmsub231ps_fma(auVar83,auVar175,auVar134);
              auVar184._0_4_ = auVar153._0_4_ * auVar134._0_4_;
              auVar184._4_4_ = auVar153._4_4_ * auVar134._4_4_;
              auVar184._8_4_ = auVar153._8_4_ * auVar134._8_4_;
              auVar184._12_4_ = auVar153._12_4_ * auVar134._12_4_;
              auVar184._16_4_ = auVar153._16_4_ * auVar134._16_4_;
              auVar184._20_4_ = auVar153._20_4_ * auVar134._20_4_;
              auVar184._24_4_ = auVar153._24_4_ * auVar134._24_4_;
              auVar184._28_4_ = 0;
              auVar180 = vfmsub231ps_fma(auVar184,auVar193,auVar190);
              auVar84._4_4_ = auVar193._4_4_ * auVar175._4_4_;
              auVar84._0_4_ = auVar193._0_4_ * auVar175._0_4_;
              auVar84._8_4_ = auVar193._8_4_ * auVar175._8_4_;
              auVar84._12_4_ = auVar193._12_4_ * auVar175._12_4_;
              auVar84._16_4_ = auVar193._16_4_ * auVar175._16_4_;
              auVar84._20_4_ = auVar193._20_4_ * auVar175._20_4_;
              auVar84._24_4_ = auVar193._24_4_ * auVar175._24_4_;
              auVar84._28_4_ = auVar175._28_4_;
              auVar181 = vfmsub231ps_fma(auVar84,auVar153,auVar20);
              auVar187 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar180),ZEXT1632(auVar181));
              auVar166 = vfmadd231ps_fma(ZEXT1632(auVar187),ZEXT1632(auVar23),ZEXT832(0) << 0x20);
              auVar159 = vrcpps_avx(ZEXT1632(auVar166));
              auVar209._8_4_ = 0x3f800000;
              auVar209._0_8_ = 0x3f8000003f800000;
              auVar209._12_4_ = 0x3f800000;
              auVar209._16_4_ = 0x3f800000;
              auVar209._20_4_ = 0x3f800000;
              auVar209._24_4_ = 0x3f800000;
              auVar209._28_4_ = 0x3f800000;
              auVar211 = ZEXT3264(auVar209);
              auVar187 = vfnmadd213ps_fma(auVar159,ZEXT1632(auVar166),auVar209);
              auVar187 = vfmadd132ps_fma(ZEXT1632(auVar187),auVar159,auVar159);
              auVar85._4_4_ = auVar181._4_4_ * auVar179._4_4_;
              auVar85._0_4_ = auVar181._0_4_ * auVar179._0_4_;
              auVar85._8_4_ = auVar181._8_4_ * auVar179._8_4_;
              auVar85._12_4_ = auVar181._12_4_ * auVar179._12_4_;
              auVar85._16_4_ = auVar179._16_4_ * 0.0;
              auVar85._20_4_ = auVar179._20_4_ * 0.0;
              auVar85._24_4_ = auVar179._24_4_ * 0.0;
              auVar85._28_4_ = auVar179._28_4_;
              auVar180 = vfmadd231ps_fma(auVar85,ZEXT1632(auVar180),auVar123);
              auVar180 = vfmadd231ps_fma(ZEXT1632(auVar180),ZEXT1632(auVar23),auVar141);
              fVar146 = auVar187._0_4_;
              fVar145 = auVar187._4_4_;
              fVar126 = auVar187._8_4_;
              fVar127 = auVar187._12_4_;
              auVar179 = ZEXT1632(CONCAT412(fVar127 * auVar180._12_4_,
                                            CONCAT48(fVar126 * auVar180._8_4_,
                                                     CONCAT44(fVar145 * auVar180._4_4_,
                                                              fVar146 * auVar180._0_4_))));
              uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar164._4_4_ = uVar112;
              auVar164._0_4_ = uVar112;
              auVar164._8_4_ = uVar112;
              auVar164._12_4_ = uVar112;
              auVar164._16_4_ = uVar112;
              auVar164._20_4_ = uVar112;
              auVar164._24_4_ = uVar112;
              auVar164._28_4_ = uVar112;
              auVar101._4_4_ = uStack_5dc;
              auVar101._0_4_ = local_5e0;
              auVar101._8_4_ = uStack_5d8;
              auVar101._12_4_ = uStack_5d4;
              auVar101._16_4_ = uStack_5d0;
              auVar101._20_4_ = uStack_5cc;
              auVar101._24_4_ = uStack_5c8;
              auVar101._28_4_ = uStack_5c4;
              auVar141 = vcmpps_avx(auVar101,auVar179,2);
              auVar123 = vcmpps_avx(auVar179,auVar164,2);
              auVar141 = vandps_avx(auVar123,auVar141);
              auVar187 = vpackssdw_avx(auVar141._0_16_,auVar141._16_16_);
              auVar10 = vpand_avx(auVar10,auVar187);
              auVar141 = vpmovsxwd_avx2(auVar10);
              if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar141 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar141 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar141 >> 0x7f,0) == '\0') &&
                    (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar141 >> 0xbf,0) == '\0') &&
                  (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar141[0x1f]) {
                auVar185 = ZEXT3264(CONCAT824(uStack_5e8,
                                              CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))))
                ;
                auVar199 = ZEXT3264(auVar152);
              }
              else {
                auVar141 = vcmpps_avx(ZEXT1632(auVar166),ZEXT832(0) << 0x20,4);
                auVar187 = vpackssdw_avx(auVar141._0_16_,auVar141._16_16_);
                auVar10 = vpand_avx(auVar10,auVar187);
                auVar141 = vpmovsxwd_avx2(auVar10);
                auVar185 = ZEXT3264(CONCAT824(uStack_5e8,
                                              CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))))
                ;
                auVar199 = ZEXT3264(auVar152);
                if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar141 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar141 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar141 >> 0x7f,0) != '\0') ||
                      (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar141 >> 0xbf,0) != '\0') ||
                    (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar141[0x1f] < '\0') {
                  auVar159 = ZEXT1632(CONCAT412(fVar127 * auVar11._12_4_,
                                                CONCAT48(fVar126 * auVar11._8_4_,
                                                         CONCAT44(fVar145 * auVar11._4_4_,
                                                                  fVar146 * auVar11._0_4_))));
                  auVar86._28_4_ = SUB84(uStack_5e8,4);
                  auVar86._0_28_ =
                       ZEXT1628(CONCAT412(fVar127 * auVar114._12_4_,
                                          CONCAT48(fVar126 * auVar114._8_4_,
                                                   CONCAT44(fVar145 * auVar114._4_4_,
                                                            fVar146 * auVar114._0_4_))));
                  auVar194._8_4_ = 0x3f800000;
                  auVar194._0_8_ = 0x3f8000003f800000;
                  auVar194._12_4_ = 0x3f800000;
                  auVar194._16_4_ = 0x3f800000;
                  auVar194._20_4_ = 0x3f800000;
                  auVar194._24_4_ = 0x3f800000;
                  auVar194._28_4_ = 0x3f800000;
                  auVar123 = vsubps_avx(auVar194,auVar159);
                  local_6a0 = vblendvps_avx(auVar123,auVar159,auVar17);
                  auVar123 = vsubps_avx(auVar194,auVar86);
                  local_4e0 = vblendvps_avx(auVar123,auVar86,auVar17);
                  auVar185 = ZEXT3264(auVar141);
                  auVar199 = ZEXT3264(auVar179);
                }
              }
            }
            auVar217 = ZEXT3264(auVar220);
            auVar205 = ZEXT3264(auVar117);
            auVar141 = auVar185._0_32_;
            if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar141 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar141 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar141 >> 0x7f,0) == '\0') &&
                  (auVar185 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                 SUB321(auVar141 >> 0xbf,0) == '\0') &&
                (auVar185 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                -1 < auVar185[0x1f]) {
              auVar143 = ZEXT3264(local_6a0);
              auVar191 = ZEXT3264(CONCAT428(fVar206,CONCAT424(fVar206,CONCAT420(fVar206,CONCAT416(
                                                  fVar206,CONCAT412(fVar206,CONCAT48(fVar206,
                                                  CONCAT44(fVar206,fVar206))))))));
              auVar185 = ZEXT3264(CONCAT428(fVar165,CONCAT424(fVar162,CONCAT420(fVar165,CONCAT416(
                                                  fVar162,CONCAT412(fVar165,CONCAT48(fVar162,uVar113
                                                                                    )))))));
            }
            else {
              auVar123 = vsubps_avx(ZEXT1632(auVar8),auVar182);
              auVar8 = vfmadd213ps_fma(auVar123,local_6a0,auVar182);
              fVar146 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
              auVar87._4_4_ = (auVar8._4_4_ + auVar8._4_4_) * fVar146;
              auVar87._0_4_ = (auVar8._0_4_ + auVar8._0_4_) * fVar146;
              auVar87._8_4_ = (auVar8._8_4_ + auVar8._8_4_) * fVar146;
              auVar87._12_4_ = (auVar8._12_4_ + auVar8._12_4_) * fVar146;
              auVar87._16_4_ = fVar146 * 0.0;
              auVar87._20_4_ = fVar146 * 0.0;
              auVar87._24_4_ = fVar146 * 0.0;
              auVar87._28_4_ = fVar146;
              local_700 = auVar199._0_32_;
              auVar123 = vcmpps_avx(local_700,auVar87,6);
              auVar179 = auVar141 & auVar123;
              auVar191 = ZEXT3264(CONCAT428(fVar206,CONCAT424(fVar206,CONCAT420(fVar206,CONCAT416(
                                                  fVar206,CONCAT412(fVar206,CONCAT48(fVar206,
                                                  CONCAT44(fVar206,fVar206))))))));
              auVar185 = ZEXT3264(CONCAT428(fVar165,CONCAT424(fVar162,CONCAT420(fVar165,CONCAT416(
                                                  fVar162,CONCAT412(fVar165,CONCAT48(fVar162,uVar113
                                                                                    )))))));
              if ((((((((auVar179 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar179 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar179 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar179 >> 0x7f,0) == '\0') &&
                    (auVar179 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar179 >> 0xbf,0) == '\0') &&
                  (auVar179 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar179[0x1f]) {
                auVar143 = ZEXT3264(local_6a0);
              }
              else {
                auVar142._8_4_ = 0xbf800000;
                auVar142._0_8_ = 0xbf800000bf800000;
                auVar142._12_4_ = 0xbf800000;
                auVar142._16_4_ = 0xbf800000;
                auVar142._20_4_ = 0xbf800000;
                auVar142._24_4_ = 0xbf800000;
                auVar142._28_4_ = 0xbf800000;
                auVar160._8_4_ = 0x40000000;
                auVar160._0_8_ = 0x4000000040000000;
                auVar160._12_4_ = 0x40000000;
                auVar160._16_4_ = 0x40000000;
                auVar160._20_4_ = 0x40000000;
                auVar160._24_4_ = 0x40000000;
                auVar160._28_4_ = 0x40000000;
                auVar8 = vfmadd213ps_fma(local_4e0,auVar160,auVar142);
                local_3a0 = local_6a0;
                local_380 = ZEXT1632(auVar8);
                local_320 = local_740;
                uStack_318 = uStack_738;
                local_310 = local_750;
                uStack_308 = uStack_748;
                pGVar13 = (context->scene->geometries).items[(uint)local_920._4_4_].ptr;
                auVar143 = ZEXT3264(local_6a0);
                local_4e0 = local_380;
                if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  bVar103 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar103 = 1, pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar141 = vandps_avx(auVar123,auVar141);
                  fVar146 = (float)local_340;
                  local_2c0[0] = (fVar146 + local_6a0._0_4_ + 0.0) * local_140;
                  local_2c0[1] = (fVar146 + local_6a0._4_4_ + 1.0) * fStack_13c;
                  local_2c0[2] = (fVar146 + local_6a0._8_4_ + 2.0) * fStack_138;
                  local_2c0[3] = (fVar146 + local_6a0._12_4_ + 3.0) * fStack_134;
                  fStack_2b0 = (fVar146 + local_6a0._16_4_ + 4.0) * fStack_130;
                  fStack_2ac = (fVar146 + local_6a0._20_4_ + 5.0) * fStack_12c;
                  fStack_2a8 = (fVar146 + local_6a0._24_4_ + 6.0) * fStack_128;
                  fStack_2a4 = fVar146 + local_6a0._28_4_ + 7.0;
                  local_4e0._0_8_ = auVar8._0_8_;
                  local_4e0._8_8_ = auVar8._8_8_;
                  local_2a0 = local_4e0._0_8_;
                  uStack_298 = local_4e0._8_8_;
                  uStack_290 = 0;
                  uStack_288 = 0;
                  local_280 = local_700;
                  uVar108 = vmovmskps_avx(auVar141);
                  if (uVar108 == 0) {
                    bVar103 = 0;
LAB_017a3f0d:
                    auVar143 = ZEXT3264(local_6a0);
                    auVar199 = ZEXT3264(local_700);
                    auVar191 = ZEXT3264(CONCAT428(fVar206,CONCAT424(fVar206,CONCAT420(fVar206,
                                                  CONCAT416(fVar206,CONCAT412(fVar206,CONCAT48(
                                                  fVar206,CONCAT44(fVar206,fVar206))))))));
                    auVar185 = ZEXT3264(CONCAT428(fVar165,CONCAT424(fVar162,CONCAT420(fVar165,
                                                  CONCAT416(fVar162,CONCAT412(fVar165,CONCAT48(
                                                  fVar162,uVar113)))))));
                  }
                  else {
                    uVar105 = (ulong)(uVar108 & 0xff);
                    _local_8e0 = ZEXT1632(CONCAT88(auVar9._8_8_,uVar105));
                    lVar22 = 0;
                    for (; (uVar105 & 1) == 0; uVar105 = uVar105 >> 1 | 0x8000000000000000) {
                      lVar22 = lVar22 + 1;
                    }
                    local_940 = ZEXT1632(CONCAT88(auVar170._8_8_,lVar22));
                    local_6c0 = ZEXT1632(CONCAT124(auVar167._4_12_,
                                                   *(undefined4 *)(ray + k * 4 + 0x100)));
                    _local_480 = *pauVar2;
                    local_360 = local_700;
                    local_33c = iVar104;
                    local_330 = uVar186;
                    uStack_328 = uVar100;
                    do {
                      fVar146 = local_2c0[local_940._0_8_];
                      auVar116._4_4_ = fVar146;
                      auVar116._0_4_ = fVar146;
                      auVar116._8_4_ = fVar146;
                      auVar116._12_4_ = fVar146;
                      local_200._16_4_ = fVar146;
                      local_200._0_16_ = auVar116;
                      local_200._20_4_ = fVar146;
                      local_200._24_4_ = fVar146;
                      local_200._28_4_ = fVar146;
                      local_1e0 = *(undefined4 *)((long)&local_2a0 + local_940._0_8_ * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) =
                           *(undefined4 *)(local_280 + local_940._0_8_ * 4);
                      fVar126 = 1.0 - fVar146;
                      auVar170 = ZEXT416((uint)(fVar146 * fVar126 * 4.0));
                      auVar167 = vfnmsub213ss_fma(auVar116,auVar116,auVar170);
                      auVar170 = vfmadd213ss_fma(ZEXT416((uint)fVar126),ZEXT416((uint)fVar126),
                                                 auVar170);
                      fVar145 = auVar170._0_4_ * 0.5;
                      fVar146 = fVar146 * fVar146 * 0.5;
                      auVar171._0_4_ = fVar146 * (float)local_610._0_4_;
                      auVar171._4_4_ = fVar146 * (float)local_610._4_4_;
                      auVar171._8_4_ = fVar146 * fStack_608;
                      auVar171._12_4_ = fVar146 * fStack_604;
                      auVar150._4_4_ = fVar145;
                      auVar150._0_4_ = fVar145;
                      auVar150._8_4_ = fVar145;
                      auVar150._12_4_ = fVar145;
                      auVar170 = vfmadd132ps_fma(auVar150,auVar171,auVar7);
                      fVar146 = auVar167._0_4_ * 0.5;
                      auVar172._4_4_ = fVar146;
                      auVar172._0_4_ = fVar146;
                      auVar172._8_4_ = fVar146;
                      auVar172._12_4_ = fVar146;
                      auVar170 = vfmadd132ps_fma(auVar172,auVar170,auVar6);
                      local_730.context = context->user;
                      fVar146 = fVar126 * -fVar126 * 0.5;
                      auVar151._4_4_ = fVar146;
                      auVar151._0_4_ = fVar146;
                      auVar151._8_4_ = fVar146;
                      auVar151._12_4_ = fVar146;
                      auVar167 = vfmadd132ps_fma(auVar151,auVar170,auVar16);
                      local_260 = auVar167._0_4_;
                      uStack_25c = local_260;
                      uStack_258 = local_260;
                      uStack_254 = local_260;
                      uStack_250 = local_260;
                      uStack_24c = local_260;
                      uStack_248 = local_260;
                      uStack_244 = local_260;
                      auVar170 = vmovshdup_avx(auVar167);
                      local_240 = auVar170._0_8_;
                      uStack_238 = local_240;
                      uStack_230 = local_240;
                      uStack_228 = local_240;
                      auVar170 = vshufps_avx(auVar167,auVar167,0xaa);
                      local_220._8_8_ = auVar170._0_8_;
                      local_220._0_8_ = local_220._8_8_;
                      local_220._16_8_ = local_220._8_8_;
                      local_220._24_8_ = local_220._8_8_;
                      uStack_1dc = local_1e0;
                      uStack_1d8 = local_1e0;
                      uStack_1d4 = local_1e0;
                      uStack_1d0 = local_1e0;
                      uStack_1cc = local_1e0;
                      uStack_1c8 = local_1e0;
                      uStack_1c4 = local_1e0;
                      local_1c0 = CONCAT44(uStack_53c,local_540);
                      uStack_1b8 = CONCAT44(uStack_534,uStack_538);
                      uStack_1b0 = CONCAT44(uStack_52c,uStack_530);
                      uStack_1a8 = CONCAT44(uStack_524,uStack_528);
                      local_1a0._4_4_ = uStack_11c;
                      local_1a0._0_4_ = local_120;
                      local_1a0._8_4_ = uStack_118;
                      local_1a0._12_4_ = uStack_114;
                      local_1a0._16_4_ = uStack_110;
                      local_1a0._20_4_ = uStack_10c;
                      local_1a0._24_4_ = uStack_108;
                      local_1a0._28_4_ = uStack_104;
                      vpcmpeqd_avx2(local_1a0,local_1a0);
                      local_180 = (local_730.context)->instID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_160 = (local_730.context)->instPrimID[0];
                      uStack_15c = local_160;
                      uStack_158 = local_160;
                      uStack_154 = local_160;
                      uStack_150 = local_160;
                      uStack_14c = local_160;
                      uStack_148 = local_160;
                      uStack_144 = local_160;
                      local_640 = local_3e0;
                      local_730.valid = (int *)local_640;
                      local_730.geometryUserPtr = pGVar13->userPtr;
                      local_730.hit = (RTCHitN *)&local_260;
                      local_730.N = 8;
                      local_730.ray = (RTCRayN *)ray;
                      if (pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar211 = ZEXT1664(auVar211._0_16_);
                        (*pGVar13->occlusionFilterN)(&local_730);
                      }
                      auVar123 = vpcmpeqd_avx2(local_640,_DAT_01faff00);
                      auVar141 = _DAT_01fe9960 & ~auVar123;
                      if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar141 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar141 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar141 >> 0x7f,0) == '\0') &&
                            (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar141 >> 0xbf,0) == '\0') &&
                          (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar141[0x1f]) {
                        auVar123 = auVar123 ^ _DAT_01fe9960;
                      }
                      else {
                        p_Var15 = context->args->filter;
                        if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar211 = ZEXT1664(auVar211._0_16_);
                          (*p_Var15)(&local_730);
                        }
                        auVar141 = vpcmpeqd_avx2(local_640,_DAT_01faff00);
                        auVar123 = auVar141 ^ _DAT_01fe9960;
                        auVar161._8_4_ = 0xff800000;
                        auVar161._0_8_ = 0xff800000ff800000;
                        auVar161._12_4_ = 0xff800000;
                        auVar161._16_4_ = 0xff800000;
                        auVar161._20_4_ = 0xff800000;
                        auVar161._24_4_ = 0xff800000;
                        auVar161._28_4_ = 0xff800000;
                        auVar141 = vblendvps_avx(auVar161,*(undefined1 (*) [32])
                                                           (local_730.ray + 0x100),auVar141);
                        *(undefined1 (*) [32])(local_730.ray + 0x100) = auVar141;
                      }
                      if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar123 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar123 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar123 >> 0x7f,0) != '\0') ||
                            (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar123 >> 0xbf,0) != '\0') ||
                          (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar123[0x1f] < '\0') {
                        bVar103 = 1;
                        goto LAB_017a3f0d;
                      }
                      *(undefined4 *)(ray + k * 4 + 0x100) = local_6c0._0_4_;
                      uVar106 = (ulong)local_8e0 ^ 1L << (local_940._0_8_ & 0x3f);
                      bVar103 = 0;
                      local_8e0 = (undefined1  [8])uVar106;
                      lVar22 = 0;
                      for (uVar105 = uVar106; (uVar105 & 1) == 0;
                          uVar105 = uVar105 >> 1 | 0x8000000000000000) {
                        lVar22 = lVar22 + 1;
                      }
                      local_940._0_8_ = lVar22;
                      auVar143 = ZEXT3264(local_6a0);
                      auVar199 = ZEXT3264(local_700);
                      auVar191 = ZEXT3264(CONCAT428(fVar206,CONCAT424(fVar206,CONCAT420(fVar206,
                                                  CONCAT416(fVar206,CONCAT412(fVar206,CONCAT48(
                                                  fVar206,CONCAT44(fVar206,fVar206))))))));
                      auVar185 = ZEXT3264(CONCAT428(fVar165,CONCAT424(fVar162,CONCAT420(fVar165,
                                                  CONCAT416(fVar162,CONCAT412(fVar165,CONCAT48(
                                                  fVar162,uVar113)))))));
                    } while (uVar106 != 0);
                  }
                }
                auVar217 = ZEXT3264(auVar220);
                auVar205 = ZEXT3264(auVar117);
                bVar107 = (bool)(bVar107 | bVar103);
              }
            }
          }
          local_6a0 = auVar143._0_32_;
          lVar111 = lVar111 + 8;
        } while ((int)lVar111 < iVar104);
      }
      if (bVar107) {
        return bVar107;
      }
      uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar124._4_4_ = uVar112;
      auVar124._0_4_ = uVar112;
      auVar124._8_4_ = uVar112;
      auVar124._12_4_ = uVar112;
      auVar124._16_4_ = uVar112;
      auVar124._20_4_ = uVar112;
      auVar124._24_4_ = uVar112;
      auVar124._28_4_ = uVar112;
      auVar117 = vcmpps_avx(local_80,auVar124,2);
      uVar108 = vmovmskps_avx(auVar117);
      uVar108 = (uint)uVar109 & uVar108;
    } while (uVar108 != 0);
  }
  return bVar107;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }